

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<4,16>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  uint uVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  byte bVar46;
  byte bVar47;
  byte bVar48;
  byte bVar49;
  ulong uVar50;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  long lVar51;
  byte bVar52;
  byte bVar53;
  ulong uVar54;
  undefined8 unaff_R13;
  ulong uVar55;
  byte bVar56;
  bool bVar57;
  ulong uVar58;
  uint uVar59;
  uint uVar133;
  uint uVar134;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  uint uVar136;
  uint uVar137;
  uint uVar138;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  uint uVar135;
  uint uVar139;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar132 [64];
  float fVar160;
  vint4 bi_2;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar161;
  vint4 bi_1;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar174 [16];
  undefined1 auVar178 [32];
  float fVar179;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar200;
  float fVar219;
  float fVar220;
  vint4 ai_2;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar221;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar218 [32];
  float fVar225;
  vint4 bi;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  vint4 ai;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar235 [32];
  undefined1 auVar234 [16];
  undefined1 auVar236 [32];
  float fVar243;
  vint4 ai_1;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 auVar242 [32];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  float fVar252;
  float fVar259;
  undefined1 auVar255 [32];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar257;
  float fVar258;
  undefined1 auVar256 [64];
  undefined1 auVar260 [32];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  float s;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  int local_ce8;
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_930 [16];
  undefined1 local_920 [16];
  float local_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [16];
  ulong local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  undefined1 auVar117 [32];
  undefined1 auVar127 [64];
  undefined1 auVar131 [64];
  undefined1 auVar151 [32];
  
  uVar50 = (ulong)(byte)prim[1];
  fVar225 = *(float *)(prim + uVar50 * 0x19 + 0x12);
  auVar66 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar66 = vinsertps_avx(auVar66,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar65 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar65 = vinsertps_avx(auVar65,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar66 = vsubps_avx(auVar66,*(undefined1 (*) [16])(prim + uVar50 * 0x19 + 6));
  auVar201._0_4_ = fVar225 * auVar66._0_4_;
  auVar201._4_4_ = fVar225 * auVar66._4_4_;
  auVar201._8_4_ = fVar225 * auVar66._8_4_;
  auVar201._12_4_ = fVar225 * auVar66._12_4_;
  auVar71._0_4_ = fVar225 * auVar65._0_4_;
  auVar71._4_4_ = fVar225 * auVar65._4_4_;
  auVar71._8_4_ = fVar225 * auVar65._8_4_;
  auVar71._12_4_ = fVar225 * auVar65._12_4_;
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 4 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 5 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar60 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 6 + 6)));
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0xb + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0xc + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar61 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0xd + 6)));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0x12 + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0x13 + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0x14 + 6)));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar267._4_4_ = auVar71._0_4_;
  auVar267._0_4_ = auVar71._0_4_;
  auVar267._8_4_ = auVar71._0_4_;
  auVar267._12_4_ = auVar71._0_4_;
  auVar69 = vshufps_avx(auVar71,auVar71,0x55);
  auVar70 = vshufps_avx(auVar71,auVar71,0xaa);
  fVar225 = auVar70._0_4_;
  auVar226._0_4_ = fVar225 * auVar60._0_4_;
  fVar160 = auVar70._4_4_;
  auVar226._4_4_ = fVar160 * auVar60._4_4_;
  fVar200 = auVar70._8_4_;
  auVar226._8_4_ = fVar200 * auVar60._8_4_;
  fVar219 = auVar70._12_4_;
  auVar226._12_4_ = fVar219 * auVar60._12_4_;
  auVar162._0_4_ = auVar61._0_4_ * fVar225;
  auVar162._4_4_ = auVar61._4_4_ * fVar160;
  auVar162._8_4_ = auVar61._8_4_ * fVar200;
  auVar162._12_4_ = auVar61._12_4_ * fVar219;
  auVar140._0_4_ = auVar62._0_4_ * fVar225;
  auVar140._4_4_ = auVar62._4_4_ * fVar160;
  auVar140._8_4_ = auVar62._8_4_ * fVar200;
  auVar140._12_4_ = auVar62._12_4_ * fVar219;
  auVar70 = vfmadd231ps_fma(auVar226,auVar69,auVar65);
  auVar64 = vfmadd231ps_fma(auVar162,auVar69,auVar11);
  auVar69 = vfmadd231ps_fma(auVar140,auVar68,auVar69);
  auVar63 = vfmadd231ps_fma(auVar70,auVar267,auVar66);
  auVar64 = vfmadd231ps_fma(auVar64,auVar267,auVar67);
  auVar71 = vfmadd231ps_fma(auVar69,auVar72,auVar267);
  auVar268._4_4_ = auVar201._0_4_;
  auVar268._0_4_ = auVar201._0_4_;
  auVar268._8_4_ = auVar201._0_4_;
  auVar268._12_4_ = auVar201._0_4_;
  auVar69 = vshufps_avx(auVar201,auVar201,0x55);
  auVar70 = vshufps_avx(auVar201,auVar201,0xaa);
  auVar60 = vmulps_avx512vl(auVar70,auVar60);
  auVar202._0_4_ = auVar70._0_4_ * auVar61._0_4_;
  auVar202._4_4_ = auVar70._4_4_ * auVar61._4_4_;
  auVar202._8_4_ = auVar70._8_4_ * auVar61._8_4_;
  auVar202._12_4_ = auVar70._12_4_ * auVar61._12_4_;
  auVar180._0_4_ = auVar70._0_4_ * auVar62._0_4_;
  auVar180._4_4_ = auVar70._4_4_ * auVar62._4_4_;
  auVar180._8_4_ = auVar70._8_4_ * auVar62._8_4_;
  auVar180._12_4_ = auVar70._12_4_ * auVar62._12_4_;
  auVar61 = vfmadd231ps_avx512vl(auVar60,auVar69,auVar65);
  auVar65 = vfmadd231ps_fma(auVar202,auVar69,auVar11);
  auVar60 = vfmadd231ps_fma(auVar180,auVar69,auVar68);
  auVar62 = vfmadd231ps_avx512vl(auVar61,auVar268,auVar66);
  auVar61 = vfmadd231ps_fma(auVar65,auVar268,auVar67);
  auVar68 = vfmadd231ps_fma(auVar60,auVar268,auVar72);
  auVar247._8_4_ = 0x7fffffff;
  auVar247._0_8_ = 0x7fffffff7fffffff;
  auVar247._12_4_ = 0x7fffffff;
  auVar66 = vandps_avx(auVar63,auVar247);
  auVar237._8_4_ = 0x219392ef;
  auVar237._0_8_ = 0x219392ef219392ef;
  auVar237._12_4_ = 0x219392ef;
  uVar55 = vcmpps_avx512vl(auVar66,auVar237,1);
  bVar57 = (bool)((byte)uVar55 & 1);
  auVar70._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar63._0_4_;
  bVar57 = (bool)((byte)(uVar55 >> 1) & 1);
  auVar70._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar63._4_4_;
  bVar57 = (bool)((byte)(uVar55 >> 2) & 1);
  auVar70._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar63._8_4_;
  bVar57 = (bool)((byte)(uVar55 >> 3) & 1);
  auVar70._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar63._12_4_;
  auVar66 = vandps_avx(auVar64,auVar247);
  uVar55 = vcmpps_avx512vl(auVar66,auVar237,1);
  bVar57 = (bool)((byte)uVar55 & 1);
  auVar63._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar64._0_4_;
  bVar57 = (bool)((byte)(uVar55 >> 1) & 1);
  auVar63._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar64._4_4_;
  bVar57 = (bool)((byte)(uVar55 >> 2) & 1);
  auVar63._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar64._8_4_;
  bVar57 = (bool)((byte)(uVar55 >> 3) & 1);
  auVar63._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar64._12_4_;
  auVar66 = vandps_avx(auVar71,auVar247);
  uVar55 = vcmpps_avx512vl(auVar66,auVar237,1);
  bVar57 = (bool)((byte)uVar55 & 1);
  auVar64._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar71._0_4_;
  bVar57 = (bool)((byte)(uVar55 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar71._4_4_;
  bVar57 = (bool)((byte)(uVar55 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar71._8_4_;
  bVar57 = (bool)((byte)(uVar55 >> 3) & 1);
  auVar64._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar71._12_4_;
  auVar65 = vrcp14ps_avx512vl(auVar70);
  auVar238._8_4_ = 0x3f800000;
  auVar238._0_8_ = 0x3f8000003f800000;
  auVar238._12_4_ = 0x3f800000;
  auVar66 = vfnmadd213ps_fma(auVar70,auVar65,auVar238);
  auVar60 = vfmadd132ps_fma(auVar66,auVar65,auVar65);
  auVar65 = vrcp14ps_avx512vl(auVar63);
  auVar66 = vfnmadd213ps_fma(auVar63,auVar65,auVar238);
  auVar11 = vfmadd132ps_fma(auVar66,auVar65,auVar65);
  auVar65 = vrcp14ps_avx512vl(auVar64);
  auVar66 = vfnmadd213ps_fma(auVar64,auVar65,auVar238);
  auVar72 = vfmadd132ps_fma(auVar66,auVar65,auVar65);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar50 * 7 + 6);
  auVar66 = vpmovsxwd_avx(auVar66);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx512vl(auVar66,auVar62);
  auVar231._0_4_ = auVar60._0_4_ * auVar66._0_4_;
  auVar231._4_4_ = auVar60._4_4_ * auVar66._4_4_;
  auVar231._8_4_ = auVar60._8_4_ * auVar66._8_4_;
  auVar231._12_4_ = auVar60._12_4_ * auVar66._12_4_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar50 * 9 + 6);
  auVar66 = vpmovsxwd_avx(auVar65);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx512vl(auVar66,auVar62);
  auVar227._0_4_ = auVar60._0_4_ * auVar66._0_4_;
  auVar227._4_4_ = auVar60._4_4_ * auVar66._4_4_;
  auVar227._8_4_ = auVar60._8_4_ * auVar66._8_4_;
  auVar227._12_4_ = auVar60._12_4_ * auVar66._12_4_;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *(ulong *)(prim + uVar50 * 0xe + 6);
  auVar66 = vpmovsxwd_avx(auVar60);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar65 = vsubps_avx(auVar66,auVar61);
  auVar60 = vpbroadcastd_avx512vl();
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar66 = vpmovsxwd_avx(auVar67);
  auVar239._0_4_ = auVar11._0_4_ * auVar65._0_4_;
  auVar239._4_4_ = auVar11._4_4_ * auVar65._4_4_;
  auVar239._8_4_ = auVar11._8_4_ * auVar65._8_4_;
  auVar239._12_4_ = auVar11._12_4_ * auVar65._12_4_;
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar61);
  auVar163._0_4_ = auVar11._0_4_ * auVar66._0_4_;
  auVar163._4_4_ = auVar11._4_4_ * auVar66._4_4_;
  auVar163._8_4_ = auVar11._8_4_ * auVar66._8_4_;
  auVar163._12_4_ = auVar11._12_4_ * auVar66._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar50 * 0x15 + 6);
  auVar66 = vpmovsxwd_avx(auVar11);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar68);
  auVar203._0_4_ = auVar72._0_4_ * auVar66._0_4_;
  auVar203._4_4_ = auVar72._4_4_ * auVar66._4_4_;
  auVar203._8_4_ = auVar72._8_4_ * auVar66._8_4_;
  auVar203._12_4_ = auVar72._12_4_ * auVar66._12_4_;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar50 * 0x17 + 6);
  auVar66 = vpmovsxwd_avx(auVar61);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar68);
  auVar141._0_4_ = auVar72._0_4_ * auVar66._0_4_;
  auVar141._4_4_ = auVar72._4_4_ * auVar66._4_4_;
  auVar141._8_4_ = auVar72._8_4_ * auVar66._8_4_;
  auVar141._12_4_ = auVar72._12_4_ * auVar66._12_4_;
  auVar66 = vpminsd_avx(auVar231,auVar227);
  auVar65 = vpminsd_avx(auVar239,auVar163);
  auVar66 = vmaxps_avx(auVar66,auVar65);
  auVar65 = vpminsd_avx(auVar203,auVar141);
  uVar161 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar72._4_4_ = uVar161;
  auVar72._0_4_ = uVar161;
  auVar72._8_4_ = uVar161;
  auVar72._12_4_ = uVar161;
  auVar65 = vmaxps_avx512vl(auVar65,auVar72);
  auVar66 = vmaxps_avx(auVar66,auVar65);
  auVar68._8_4_ = 0x3f7ffffa;
  auVar68._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar68._12_4_ = 0x3f7ffffa;
  local_700 = vmulps_avx512vl(auVar66,auVar68);
  auVar66 = vpmaxsd_avx(auVar231,auVar227);
  auVar65 = vpmaxsd_avx(auVar239,auVar163);
  auVar66 = vminps_avx(auVar66,auVar65);
  auVar65 = vpmaxsd_avx(auVar203,auVar141);
  uVar161 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar62._4_4_ = uVar161;
  auVar62._0_4_ = uVar161;
  auVar62._8_4_ = uVar161;
  auVar62._12_4_ = uVar161;
  auVar65 = vminps_avx512vl(auVar65,auVar62);
  auVar66 = vminps_avx(auVar66,auVar65);
  auVar69._8_4_ = 0x3f800003;
  auVar69._0_8_ = 0x3f8000033f800003;
  auVar69._12_4_ = 0x3f800003;
  auVar66 = vmulps_avx512vl(auVar66,auVar69);
  uVar12 = vcmpps_avx512vl(local_700,auVar66,2);
  uVar14 = vpcmpgtd_avx512vl(auVar60,_DAT_01f4ad30);
  uVar55 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)((byte)uVar12 & 0xf & (byte)uVar14));
  auVar159 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_500 = vmovdqa64_avx512f(auVar159);
LAB_017fb0be:
  if (uVar55 == 0) {
LAB_017fdaa0:
    return uVar55 != 0;
  }
  lVar51 = 0;
  for (uVar50 = uVar55; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
    lVar51 = lVar51 + 1;
  }
  uVar1 = *(uint *)(prim + 2);
  pGVar2 = (context->scene->geometries).items[uVar1].ptr;
  uVar50 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar51 * 4 + 6));
  p_Var3 = pGVar2[1].intersectionFilterN;
  lVar51 = *(long *)&pGVar2[1].time_range.upper;
  auVar66 = *(undefined1 (*) [16])(lVar51 + (long)p_Var3 * uVar50);
  auVar65 = *(undefined1 (*) [16])(lVar51 + (uVar50 + 1) * (long)p_Var3);
  local_8e8 = uVar55 - 1 & uVar55;
  if (local_8e8 != 0) {
    uVar54 = local_8e8 - 1 & local_8e8;
    for (uVar58 = local_8e8; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
    }
    if (uVar54 != 0) {
      for (; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar60 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar67 = vinsertps_avx(auVar60,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar161 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar263._4_4_ = uVar161;
  auVar263._0_4_ = uVar161;
  auVar263._8_4_ = uVar161;
  auVar263._12_4_ = uVar161;
  local_800._16_4_ = uVar161;
  local_800._0_16_ = auVar263;
  local_800._20_4_ = uVar161;
  local_800._24_4_ = uVar161;
  local_800._28_4_ = uVar161;
  uVar161 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar269._4_4_ = uVar161;
  auVar269._0_4_ = uVar161;
  auVar269._8_4_ = uVar161;
  auVar269._12_4_ = uVar161;
  local_820._16_4_ = uVar161;
  local_820._0_16_ = auVar269;
  local_820._20_4_ = uVar161;
  local_820._24_4_ = uVar161;
  local_820._28_4_ = uVar161;
  auVar60 = vunpcklps_avx(auVar263,auVar269);
  fVar225 = *(float *)(ray + k * 4 + 0x180);
  auVar270._4_4_ = fVar225;
  auVar270._0_4_ = fVar225;
  auVar270._8_4_ = fVar225;
  auVar270._12_4_ = fVar225;
  local_840._16_4_ = fVar225;
  local_840._0_16_ = auVar270;
  local_840._20_4_ = fVar225;
  local_840._24_4_ = fVar225;
  local_840._28_4_ = fVar225;
  local_9d0 = vinsertps_avx(auVar60,auVar270,0x28);
  auVar232._0_4_ = auVar66._0_4_ + auVar65._0_4_;
  auVar232._4_4_ = auVar66._4_4_ + auVar65._4_4_;
  auVar232._8_4_ = auVar66._8_4_ + auVar65._8_4_;
  auVar232._12_4_ = auVar66._12_4_ + auVar65._12_4_;
  auVar16._8_4_ = 0x3f000000;
  auVar16._0_8_ = 0x3f0000003f000000;
  auVar16._12_4_ = 0x3f000000;
  auVar60 = vmulps_avx512vl(auVar232,auVar16);
  auVar60 = vsubps_avx(auVar60,auVar67);
  auVar60 = vdpps_avx(auVar60,local_9d0,0x7f);
  fVar160 = *(float *)(ray + k * 4 + 0xc0);
  auVar261 = ZEXT464((uint)fVar160);
  local_9e0 = vdpps_avx(local_9d0,local_9d0,0x7f);
  auVar262 = ZEXT1664(local_9e0);
  auVar240._4_12_ = ZEXT812(0) << 0x20;
  auVar240._0_4_ = local_9e0._0_4_;
  auVar61 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar240);
  auVar11 = vfnmadd213ss_fma(auVar61,local_9e0,ZEXT416(0x40000000));
  local_660 = auVar60._0_4_ * auVar61._0_4_ * auVar11._0_4_;
  auVar241._4_4_ = local_660;
  auVar241._0_4_ = local_660;
  auVar241._8_4_ = local_660;
  auVar241._12_4_ = local_660;
  fStack_7d0 = local_660;
  _local_7e0 = auVar241;
  fStack_7cc = local_660;
  fStack_7c8 = local_660;
  fStack_7c4 = local_660;
  auVar60 = vfmadd231ps_fma(auVar67,local_9d0,auVar241);
  auVar60 = vblendps_avx(auVar60,ZEXT816(0) << 0x40,8);
  auVar66 = vsubps_avx(auVar66,auVar60);
  auVar67 = vsubps_avx(*(undefined1 (*) [16])(lVar51 + (uVar50 + 2) * (long)p_Var3),auVar60);
  auVar251 = ZEXT1664(auVar67);
  auVar65 = vsubps_avx(auVar65,auVar60);
  auVar256 = ZEXT1664(auVar65);
  auVar60 = vsubps_avx(*(undefined1 (*) [16])(lVar51 + (uVar50 + 3) * (long)p_Var3),auVar60);
  auVar73 = vbroadcastss_avx512vl(auVar66);
  auVar84._8_4_ = 1;
  auVar84._0_8_ = 0x100000001;
  auVar84._12_4_ = 1;
  auVar84._16_4_ = 1;
  auVar84._20_4_ = 1;
  auVar84._24_4_ = 1;
  auVar84._28_4_ = 1;
  local_960 = ZEXT1632(auVar66);
  auVar74 = vpermps_avx512vl(auVar84,local_960);
  auVar85._8_4_ = 2;
  auVar85._0_8_ = 0x200000002;
  auVar85._12_4_ = 2;
  auVar85._16_4_ = 2;
  auVar85._20_4_ = 2;
  auVar85._24_4_ = 2;
  auVar85._28_4_ = 2;
  auVar75 = vpermps_avx512vl(auVar85,local_960);
  auVar86._8_4_ = 3;
  auVar86._0_8_ = 0x300000003;
  auVar86._12_4_ = 3;
  auVar86._16_4_ = 3;
  auVar86._20_4_ = 3;
  auVar86._24_4_ = 3;
  auVar86._28_4_ = 3;
  auVar76 = vpermps_avx512vl(auVar86,local_960);
  auVar77 = vbroadcastss_avx512vl(auVar65);
  local_9a0 = ZEXT1632(auVar65);
  auVar78 = vpermps_avx512vl(auVar84,local_9a0);
  auVar79 = vpermps_avx512vl(auVar85,local_9a0);
  auVar80 = vpermps_avx512vl(auVar86,local_9a0);
  auVar81 = vbroadcastss_avx512vl(auVar67);
  local_980 = ZEXT1632(auVar67);
  auVar82 = vpermps_avx512vl(auVar84,local_980);
  local_5c0 = vpermps_avx512vl(auVar85,local_980);
  local_5e0 = vpermps_avx512vl(auVar86,local_980);
  local_5a0 = vbroadcastss_avx512vl(auVar60);
  _local_9c0 = ZEXT1632(auVar60);
  local_620 = vpermps_avx2(auVar84,_local_9c0);
  local_560 = vpermps_avx2(auVar85,_local_9c0);
  local_640 = vpermps_avx2(auVar86,_local_9c0);
  auVar66 = vfmadd231ps_fma(ZEXT432((uint)(fVar225 * fVar225)),local_820,local_820);
  auVar66 = vfmadd231ps_fma(ZEXT1632(auVar66),local_800,local_800);
  local_580._0_4_ = auVar66._0_4_;
  local_580._4_4_ = local_580._0_4_;
  local_580._8_4_ = local_580._0_4_;
  local_580._12_4_ = local_580._0_4_;
  local_580._16_4_ = local_580._0_4_;
  local_580._20_4_ = local_580._0_4_;
  local_580._24_4_ = local_580._0_4_;
  local_580._28_4_ = local_580._0_4_;
  auVar83._8_4_ = 0x7fffffff;
  auVar83._0_8_ = 0x7fffffff7fffffff;
  auVar83._12_4_ = 0x7fffffff;
  auVar83._16_4_ = 0x7fffffff;
  auVar83._20_4_ = 0x7fffffff;
  auVar83._24_4_ = 0x7fffffff;
  auVar83._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_580,auVar83);
  local_930 = ZEXT416((uint)local_660);
  local_660 = fVar160 - local_660;
  fStack_65c = local_660;
  fStack_658 = local_660;
  fStack_654 = local_660;
  fStack_650 = local_660;
  fStack_64c = local_660;
  fStack_648 = local_660;
  fStack_644 = local_660;
  auVar159 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar159);
  uVar50 = 0;
  bVar49 = 0;
  local_ce8 = 1;
  auVar159 = vpbroadcastd_avx512f();
  local_4c0 = vmovdqa64_avx512f(auVar159);
  auVar66 = vsqrtss_avx(local_9e0,local_9e0);
  auVar65 = vsqrtss_avx(local_9e0,local_9e0);
  local_6f0 = ZEXT816(0x3f80000000000000);
  auVar159 = ZEXT3264(_DAT_01f7b040);
  local_600 = local_5a0;
  do {
    auVar60 = vmovshdup_avx(local_6f0);
    auVar60 = vsubps_avx(auVar60,local_6f0);
    auVar142._0_4_ = auVar60._0_4_;
    fVar225 = auVar142._0_4_ * 0.04761905;
    uVar161 = local_6f0._0_4_;
    auVar230._4_4_ = uVar161;
    auVar230._0_4_ = uVar161;
    auVar230._8_4_ = uVar161;
    auVar230._12_4_ = uVar161;
    auVar230._16_4_ = uVar161;
    auVar230._20_4_ = uVar161;
    auVar230._24_4_ = uVar161;
    auVar230._28_4_ = uVar161;
    auVar142._4_4_ = auVar142._0_4_;
    auVar142._8_4_ = auVar142._0_4_;
    auVar142._12_4_ = auVar142._0_4_;
    auVar151._16_4_ = auVar142._0_4_;
    auVar151._0_16_ = auVar142;
    auVar151._20_4_ = auVar142._0_4_;
    auVar151._24_4_ = auVar142._0_4_;
    auVar151._28_4_ = auVar142._0_4_;
    auVar60 = vfmadd231ps_fma(auVar230,auVar151,auVar159._0_32_);
    auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar83 = vsubps_avx512vl(auVar83,ZEXT1632(auVar60));
    fVar200 = auVar60._0_4_;
    fVar219 = auVar60._4_4_;
    fVar220 = auVar60._8_4_;
    fVar221 = auVar60._12_4_;
    fVar223 = auVar83._0_4_;
    fVar224 = auVar83._4_4_;
    fVar243 = auVar83._8_4_;
    fVar244 = auVar83._12_4_;
    fVar245 = auVar83._16_4_;
    fVar179 = auVar83._20_4_;
    fVar246 = auVar83._24_4_;
    auVar88._4_4_ = fVar224 * fVar224 * -fVar219;
    auVar88._0_4_ = fVar223 * fVar223 * -fVar200;
    auVar88._8_4_ = fVar243 * fVar243 * -fVar220;
    auVar88._12_4_ = fVar244 * fVar244 * -fVar221;
    auVar88._16_4_ = fVar245 * fVar245 * -0.0;
    auVar88._20_4_ = fVar179 * fVar179 * -0.0;
    auVar88._24_4_ = fVar246 * fVar246 * -0.0;
    auVar88._28_4_ = 0x80000000;
    auVar159._28_36_ = auVar251._28_36_;
    auVar159._0_28_ =
         ZEXT1628(CONCAT412(fVar221 * fVar221,
                            CONCAT48(fVar220 * fVar220,CONCAT44(fVar219 * fVar219,fVar200 * fVar200)
                                    )));
    fVar252 = fVar200 * 3.0;
    fVar257 = fVar219 * 3.0;
    fVar258 = fVar220 * 3.0;
    fVar259 = fVar221 * 3.0;
    auVar251._28_36_ = auVar256._28_36_;
    auVar251._0_28_ = ZEXT1628(CONCAT412(fVar259,CONCAT48(fVar258,CONCAT44(fVar257,fVar252))));
    auVar105._0_4_ = (fVar252 + -5.0) * fVar200 * fVar200;
    auVar105._4_4_ = (fVar257 + -5.0) * fVar219 * fVar219;
    auVar105._8_4_ = (fVar258 + -5.0) * fVar220 * fVar220;
    auVar105._12_4_ = (fVar259 + -5.0) * fVar221 * fVar221;
    auVar105._16_4_ = 0x80000000;
    auVar105._20_4_ = 0x80000000;
    auVar105._24_4_ = 0x80000000;
    auVar105._28_4_ = 0;
    auVar84 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
    auVar85 = vaddps_avx512vl(auVar105,auVar84);
    auVar128._0_4_ = fVar223 * fVar223;
    auVar128._4_4_ = fVar224 * fVar224;
    auVar128._8_4_ = fVar243 * fVar243;
    auVar128._12_4_ = fVar244 * fVar244;
    auVar128._16_4_ = fVar245 * fVar245;
    auVar128._20_4_ = fVar179 * fVar179;
    auVar128._28_36_ = auVar261._28_36_;
    auVar128._24_4_ = fVar246 * fVar246;
    auVar91._4_4_ = auVar128._4_4_ * (fVar224 * 3.0 + -5.0);
    auVar91._0_4_ = auVar128._0_4_ * (fVar223 * 3.0 + -5.0);
    auVar91._8_4_ = auVar128._8_4_ * (fVar243 * 3.0 + -5.0);
    auVar91._12_4_ = auVar128._12_4_ * (fVar244 * 3.0 + -5.0);
    auVar91._16_4_ = auVar128._16_4_ * (fVar245 * 3.0 + -5.0);
    auVar91._20_4_ = auVar128._20_4_ * (fVar179 * 3.0 + -5.0);
    auVar91._24_4_ = auVar128._24_4_ * (fVar246 * 3.0 + -5.0);
    auVar91._28_4_ = auVar262._28_4_ + -5.0;
    auVar86 = vaddps_avx512vl(auVar91,auVar84);
    fVar222 = auVar83._28_4_;
    auVar92._4_4_ = fVar219 * fVar219 * -fVar224;
    auVar92._0_4_ = fVar200 * fVar200 * -fVar223;
    auVar92._8_4_ = fVar220 * fVar220 * -fVar243;
    auVar92._12_4_ = fVar221 * fVar221 * -fVar244;
    auVar92._16_4_ = -fVar245 * 0.0 * 0.0;
    auVar92._20_4_ = -fVar179 * 0.0 * 0.0;
    auVar92._24_4_ = -fVar246 * 0.0 * 0.0;
    auVar92._28_4_ = -fVar222;
    auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar83 = vmulps_avx512vl(auVar88,auVar87);
    auVar88 = vmulps_avx512vl(auVar85,auVar87);
    auVar86 = vmulps_avx512vl(auVar86,auVar87);
    auVar89 = vmulps_avx512vl(auVar92,auVar87);
    auVar90 = vmulps_avx512vl(local_600,auVar89);
    auVar93._4_4_ = local_620._4_4_ * auVar89._4_4_;
    auVar93._0_4_ = local_620._0_4_ * auVar89._0_4_;
    auVar93._8_4_ = local_620._8_4_ * auVar89._8_4_;
    auVar93._12_4_ = local_620._12_4_ * auVar89._12_4_;
    auVar93._16_4_ = local_620._16_4_ * auVar89._16_4_;
    auVar93._20_4_ = local_620._20_4_ * auVar89._20_4_;
    auVar93._24_4_ = local_620._24_4_ * auVar89._24_4_;
    auVar93._28_4_ = auVar85._28_4_;
    auVar85 = vmulps_avx512vl(local_560,auVar89);
    auVar94._4_4_ = local_640._4_4_ * auVar89._4_4_;
    auVar94._0_4_ = local_640._0_4_ * auVar89._0_4_;
    auVar94._8_4_ = local_640._8_4_ * auVar89._8_4_;
    auVar94._12_4_ = local_640._12_4_ * auVar89._12_4_;
    auVar94._16_4_ = local_640._16_4_ * auVar89._16_4_;
    auVar94._20_4_ = local_640._20_4_ * auVar89._20_4_;
    auVar94._24_4_ = local_640._24_4_ * auVar89._24_4_;
    auVar94._28_4_ = auVar89._28_4_;
    auVar89 = vfmadd231ps_avx512vl(auVar90,auVar86,auVar81);
    auVar90 = vfmadd231ps_avx512vl(auVar93,auVar86,auVar82);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar86,local_5c0);
    auVar86 = vfmadd231ps_avx512vl(auVar94,local_5e0,auVar86);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar88,auVar77);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar88,auVar78);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar88,auVar79);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar80,auVar88);
    auVar91 = vfmadd231ps_avx512vl(auVar89,auVar83,auVar73);
    auVar92 = vfmadd231ps_avx512vl(auVar90,auVar83,auVar74);
    auVar93 = vfmadd231ps_avx512vl(auVar85,auVar83,auVar75);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar76,auVar83);
    auVar95._4_4_ = (fVar224 + fVar224) * fVar219;
    auVar95._0_4_ = (fVar223 + fVar223) * fVar200;
    auVar95._8_4_ = (fVar243 + fVar243) * fVar220;
    auVar95._12_4_ = (fVar244 + fVar244) * fVar221;
    auVar95._16_4_ = (fVar245 + fVar245) * 0.0;
    auVar95._20_4_ = (fVar179 + fVar179) * 0.0;
    auVar95._24_4_ = (fVar246 + fVar246) * 0.0;
    auVar95._28_4_ = auVar88._28_4_;
    auVar83 = vsubps_avx(auVar95,auVar128._0_32_);
    auVar106._0_28_ =
         ZEXT1628(CONCAT412((fVar221 + fVar221) * (fVar259 + -5.0) + fVar259 * fVar221,
                            CONCAT48((fVar220 + fVar220) * (fVar258 + -5.0) + fVar258 * fVar220,
                                     CONCAT44((fVar219 + fVar219) * (fVar257 + -5.0) +
                                              fVar257 * fVar219,
                                              (fVar200 + fVar200) * (fVar252 + -5.0) +
                                              fVar252 * fVar200))));
    auVar106._28_4_ = auVar256._28_4_ + -5.0 + 0.0;
    auVar84 = vaddps_avx512vl(auVar251._0_32_,auVar84);
    auVar96._4_4_ = (fVar224 + fVar224) * auVar84._4_4_;
    auVar96._0_4_ = (fVar223 + fVar223) * auVar84._0_4_;
    auVar96._8_4_ = (fVar243 + fVar243) * auVar84._8_4_;
    auVar96._12_4_ = (fVar244 + fVar244) * auVar84._12_4_;
    auVar96._16_4_ = (fVar245 + fVar245) * auVar84._16_4_;
    auVar96._20_4_ = (fVar179 + fVar179) * auVar84._20_4_;
    auVar96._24_4_ = (fVar246 + fVar246) * auVar84._24_4_;
    auVar96._28_4_ = auVar84._28_4_;
    auVar97._4_4_ = fVar224 * 3.0 * fVar224;
    auVar97._0_4_ = fVar223 * 3.0 * fVar223;
    auVar97._8_4_ = fVar243 * 3.0 * fVar243;
    auVar97._12_4_ = fVar244 * 3.0 * fVar244;
    auVar97._16_4_ = fVar245 * 3.0 * fVar245;
    auVar97._20_4_ = fVar179 * 3.0 * fVar179;
    auVar97._24_4_ = fVar246 * 3.0 * fVar246;
    auVar97._28_4_ = fVar222;
    auVar84 = vsubps_avx(auVar96,auVar97);
    auVar85 = vsubps_avx(auVar159._0_32_,auVar95);
    auVar89 = vmulps_avx512vl(auVar83,auVar87);
    auVar90 = vmulps_avx512vl(auVar106,auVar87);
    auVar84 = vmulps_avx512vl(auVar84,auVar87);
    auVar85 = vmulps_avx512vl(auVar85,auVar87);
    auVar87 = vmulps_avx512vl(local_600,auVar85);
    auVar98._4_4_ = local_620._4_4_ * auVar85._4_4_;
    auVar98._0_4_ = local_620._0_4_ * auVar85._0_4_;
    auVar98._8_4_ = local_620._8_4_ * auVar85._8_4_;
    auVar98._12_4_ = local_620._12_4_ * auVar85._12_4_;
    auVar98._16_4_ = local_620._16_4_ * auVar85._16_4_;
    auVar98._20_4_ = local_620._20_4_ * auVar85._20_4_;
    auVar98._24_4_ = local_620._24_4_ * auVar85._24_4_;
    auVar98._28_4_ = auVar83._28_4_;
    auVar83 = vmulps_avx512vl(local_560,auVar85);
    auVar99._4_4_ = local_640._4_4_ * auVar85._4_4_;
    auVar99._0_4_ = local_640._0_4_ * auVar85._0_4_;
    auVar99._8_4_ = local_640._8_4_ * auVar85._8_4_;
    auVar99._12_4_ = local_640._12_4_ * auVar85._12_4_;
    auVar99._16_4_ = local_640._16_4_ * auVar85._16_4_;
    auVar99._20_4_ = local_640._20_4_ * auVar85._20_4_;
    auVar99._24_4_ = local_640._24_4_ * auVar85._24_4_;
    auVar99._28_4_ = auVar85._28_4_;
    auVar85 = vfmadd231ps_avx512vl(auVar87,auVar84,auVar81);
    auVar87 = vfmadd231ps_avx512vl(auVar98,auVar84,auVar82);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar84,local_5c0);
    auVar84 = vfmadd231ps_avx512vl(auVar99,local_5e0,auVar84);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar90,auVar77);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar90,auVar78);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar90,auVar79);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar80,auVar90);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar89,auVar73);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar89,auVar74);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar89,auVar75);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar76,auVar89);
    auVar113._4_4_ = auVar85._4_4_ * fVar225;
    auVar113._0_4_ = auVar85._0_4_ * fVar225;
    auVar113._8_4_ = auVar85._8_4_ * fVar225;
    auVar113._12_4_ = auVar85._12_4_ * fVar225;
    auVar113._16_4_ = auVar85._16_4_ * fVar225;
    auVar113._20_4_ = auVar85._20_4_ * fVar225;
    auVar113._24_4_ = auVar85._24_4_ * fVar225;
    auVar113._28_4_ = fVar222 + fVar222;
    auVar114._4_4_ = auVar87._4_4_ * fVar225;
    auVar114._0_4_ = auVar87._0_4_ * fVar225;
    auVar114._8_4_ = auVar87._8_4_ * fVar225;
    auVar114._12_4_ = auVar87._12_4_ * fVar225;
    auVar114._16_4_ = auVar87._16_4_ * fVar225;
    auVar114._20_4_ = auVar87._20_4_ * fVar225;
    auVar114._24_4_ = auVar87._24_4_ * fVar225;
    auVar114._28_4_ = auVar88._28_4_;
    auVar115._4_4_ = auVar83._4_4_ * fVar225;
    auVar115._0_4_ = auVar83._0_4_ * fVar225;
    auVar115._8_4_ = auVar83._8_4_ * fVar225;
    auVar115._12_4_ = auVar83._12_4_ * fVar225;
    auVar115._16_4_ = auVar83._16_4_ * fVar225;
    auVar115._20_4_ = auVar83._20_4_ * fVar225;
    auVar115._24_4_ = auVar83._24_4_ * fVar225;
    auVar115._28_4_ = 0;
    fVar200 = fVar225 * auVar84._0_4_;
    fVar219 = fVar225 * auVar84._4_4_;
    auVar103._4_4_ = fVar219;
    auVar103._0_4_ = fVar200;
    fVar220 = fVar225 * auVar84._8_4_;
    auVar103._8_4_ = fVar220;
    fVar221 = fVar225 * auVar84._12_4_;
    auVar103._12_4_ = fVar221;
    fVar222 = fVar225 * auVar84._16_4_;
    auVar103._16_4_ = fVar222;
    fVar223 = fVar225 * auVar84._20_4_;
    auVar103._20_4_ = fVar223;
    fVar224 = fVar225 * auVar84._24_4_;
    auVar103._24_4_ = fVar224;
    auVar103._28_4_ = fVar225;
    auVar60 = vxorps_avx512vl(auVar80._0_16_,auVar80._0_16_);
    auVar94 = vpermt2ps_avx512vl(auVar91,_DAT_01fb9fc0,ZEXT1632(auVar60));
    auVar95 = vpermt2ps_avx512vl(auVar92,_DAT_01fb9fc0,ZEXT1632(auVar60));
    auVar261 = ZEXT3264(auVar95);
    auVar85 = ZEXT1632(auVar60);
    auVar96 = vpermt2ps_avx512vl(auVar93,_DAT_01fb9fc0,auVar85);
    auVar262 = ZEXT3264(auVar96);
    auVar107._0_4_ = auVar86._0_4_ + fVar200;
    auVar107._4_4_ = auVar86._4_4_ + fVar219;
    auVar107._8_4_ = auVar86._8_4_ + fVar220;
    auVar107._12_4_ = auVar86._12_4_ + fVar221;
    auVar107._16_4_ = auVar86._16_4_ + fVar222;
    auVar107._20_4_ = auVar86._20_4_ + fVar223;
    auVar107._24_4_ = auVar86._24_4_ + fVar224;
    auVar107._28_4_ = auVar86._28_4_ + fVar225;
    auVar83 = vmaxps_avx(auVar86,auVar107);
    auVar84 = vminps_avx(auVar86,auVar107);
    auVar89 = vpermt2ps_avx512vl(auVar86,_DAT_01fb9fc0,auVar85);
    auVar97 = vpermt2ps_avx512vl(auVar113,_DAT_01fb9fc0,auVar85);
    auVar98 = vpermt2ps_avx512vl(auVar114,_DAT_01fb9fc0,auVar85);
    auVar109 = ZEXT1632(auVar60);
    auVar99 = vpermt2ps_avx512vl(auVar115,_DAT_01fb9fc0,auVar109);
    auVar85 = vpermt2ps_avx512vl(auVar103,_DAT_01fb9fc0,auVar109);
    auVar90 = vsubps_avx512vl(auVar89,auVar85);
    auVar85 = vsubps_avx(auVar94,auVar91);
    auVar256 = ZEXT3264(auVar85);
    auVar86 = vsubps_avx(auVar95,auVar92);
    auVar251 = ZEXT3264(auVar86);
    auVar88 = vsubps_avx(auVar96,auVar93);
    auVar87 = vmulps_avx512vl(auVar86,auVar115);
    auVar87 = vfmsub231ps_avx512vl(auVar87,auVar114,auVar88);
    auVar100 = vmulps_avx512vl(auVar88,auVar113);
    auVar100 = vfmsub231ps_avx512vl(auVar100,auVar115,auVar85);
    auVar101 = vmulps_avx512vl(auVar85,auVar114);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar113,auVar86);
    auVar101 = vmulps_avx512vl(auVar101,auVar101);
    auVar100 = vfmadd231ps_avx512vl(auVar101,auVar100,auVar100);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar87,auVar87);
    auVar87 = vmulps_avx512vl(auVar88,auVar88);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar86,auVar86);
    auVar101 = vfmadd231ps_avx512vl(auVar87,auVar85,auVar85);
    auVar102 = vrcp14ps_avx512vl(auVar101);
    auVar87._8_4_ = 0x3f800000;
    auVar87._0_8_ = 0x3f8000003f800000;
    auVar87._12_4_ = 0x3f800000;
    auVar87._16_4_ = 0x3f800000;
    auVar87._20_4_ = 0x3f800000;
    auVar87._24_4_ = 0x3f800000;
    auVar87._28_4_ = 0x3f800000;
    auVar87 = vfnmadd213ps_avx512vl(auVar102,auVar101,auVar87);
    auVar87 = vfmadd132ps_avx512vl(auVar87,auVar102,auVar102);
    auVar100 = vmulps_avx512vl(auVar100,auVar87);
    auVar102 = vmulps_avx512vl(auVar86,auVar99);
    auVar102 = vfmsub231ps_avx512vl(auVar102,auVar98,auVar88);
    auVar103 = vmulps_avx512vl(auVar88,auVar97);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar99,auVar85);
    auVar104 = vmulps_avx512vl(auVar85,auVar98);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar97,auVar86);
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar103);
    auVar102 = vfmadd231ps_avx512vl(auVar103,auVar102,auVar102);
    auVar87 = vmulps_avx512vl(auVar102,auVar87);
    auVar87 = vmaxps_avx512vl(auVar100,auVar87);
    auVar87 = vsqrtps_avx512vl(auVar87);
    auVar100 = vmaxps_avx512vl(auVar90,auVar89);
    auVar83 = vmaxps_avx512vl(auVar83,auVar100);
    auVar102 = vaddps_avx512vl(auVar87,auVar83);
    auVar83 = vminps_avx512vl(auVar90,auVar89);
    auVar83 = vminps_avx(auVar84,auVar83);
    auVar83 = vsubps_avx512vl(auVar83,auVar87);
    auVar89._8_4_ = 0x3f800002;
    auVar89._0_8_ = 0x3f8000023f800002;
    auVar89._12_4_ = 0x3f800002;
    auVar89._16_4_ = 0x3f800002;
    auVar89._20_4_ = 0x3f800002;
    auVar89._24_4_ = 0x3f800002;
    auVar89._28_4_ = 0x3f800002;
    auVar84 = vmulps_avx512vl(auVar102,auVar89);
    auVar90._8_4_ = 0x3f7ffffc;
    auVar90._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar90._12_4_ = 0x3f7ffffc;
    auVar90._16_4_ = 0x3f7ffffc;
    auVar90._20_4_ = 0x3f7ffffc;
    auVar90._24_4_ = 0x3f7ffffc;
    auVar90._28_4_ = 0x3f7ffffc;
    auVar83 = vmulps_avx512vl(auVar83,auVar90);
    auVar84 = vmulps_avx512vl(auVar84,auVar84);
    auVar87 = vrsqrt14ps_avx512vl(auVar101);
    auVar100._8_4_ = 0xbf000000;
    auVar100._0_8_ = 0xbf000000bf000000;
    auVar100._12_4_ = 0xbf000000;
    auVar100._16_4_ = 0xbf000000;
    auVar100._20_4_ = 0xbf000000;
    auVar100._24_4_ = 0xbf000000;
    auVar100._28_4_ = 0xbf000000;
    auVar89 = vmulps_avx512vl(auVar101,auVar100);
    fVar225 = auVar87._0_4_;
    fVar200 = auVar87._4_4_;
    fVar219 = auVar87._8_4_;
    fVar220 = auVar87._12_4_;
    fVar221 = auVar87._16_4_;
    fVar222 = auVar87._20_4_;
    fVar223 = auVar87._24_4_;
    auVar104._4_4_ = fVar200 * fVar200 * fVar200 * auVar89._4_4_;
    auVar104._0_4_ = fVar225 * fVar225 * fVar225 * auVar89._0_4_;
    auVar104._8_4_ = fVar219 * fVar219 * fVar219 * auVar89._8_4_;
    auVar104._12_4_ = fVar220 * fVar220 * fVar220 * auVar89._12_4_;
    auVar104._16_4_ = fVar221 * fVar221 * fVar221 * auVar89._16_4_;
    auVar104._20_4_ = fVar222 * fVar222 * fVar222 * auVar89._20_4_;
    auVar104._24_4_ = fVar223 * fVar223 * fVar223 * auVar89._24_4_;
    auVar104._28_4_ = auVar102._28_4_;
    auVar101._8_4_ = 0x3fc00000;
    auVar101._0_8_ = 0x3fc000003fc00000;
    auVar101._12_4_ = 0x3fc00000;
    auVar101._16_4_ = 0x3fc00000;
    auVar101._20_4_ = 0x3fc00000;
    auVar101._24_4_ = 0x3fc00000;
    auVar101._28_4_ = 0x3fc00000;
    auVar87 = vfmadd231ps_avx512vl(auVar104,auVar87,auVar101);
    auVar89 = vmulps_avx512vl(auVar85,auVar87);
    auVar90 = vmulps_avx512vl(auVar86,auVar87);
    auVar100 = vmulps_avx512vl(auVar88,auVar87);
    auVar101 = vsubps_avx512vl(auVar109,auVar91);
    auVar103 = vsubps_avx512vl(auVar109,auVar92);
    auVar104 = vsubps_avx512vl(auVar109,auVar93);
    auVar102 = vmulps_avx512vl(local_840,auVar104);
    auVar102 = vfmadd231ps_avx512vl(auVar102,local_820,auVar103);
    auVar102 = vfmadd231ps_avx512vl(auVar102,local_800,auVar101);
    auVar105 = vmulps_avx512vl(auVar104,auVar104);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar103,auVar103);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar101,auVar101);
    auVar106 = vmulps_avx512vl(local_840,auVar100);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar90,local_820);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar89,local_800);
    auVar100 = vmulps_avx512vl(auVar104,auVar100);
    auVar90 = vfmadd231ps_avx512vl(auVar100,auVar103,auVar90);
    auVar89 = vfmadd231ps_avx512vl(auVar90,auVar101,auVar89);
    auVar90 = vmulps_avx512vl(auVar106,auVar106);
    auVar100 = vsubps_avx512vl(local_580,auVar90);
    auVar107 = vmulps_avx512vl(auVar106,auVar89);
    auVar102 = vsubps_avx512vl(auVar102,auVar107);
    auVar107 = vaddps_avx512vl(auVar102,auVar102);
    auVar102 = vmulps_avx512vl(auVar89,auVar89);
    auVar105 = vsubps_avx512vl(auVar105,auVar102);
    auVar84 = vsubps_avx512vl(auVar105,auVar84);
    auVar108 = vmulps_avx512vl(auVar107,auVar107);
    auVar102._8_4_ = 0x40800000;
    auVar102._0_8_ = 0x4080000040800000;
    auVar102._12_4_ = 0x40800000;
    auVar102._16_4_ = 0x40800000;
    auVar102._20_4_ = 0x40800000;
    auVar102._24_4_ = 0x40800000;
    auVar102._28_4_ = 0x40800000;
    _local_860 = vmulps_avx512vl(auVar100,auVar102);
    auVar102 = vmulps_avx512vl(_local_860,auVar84);
    auVar102 = vsubps_avx512vl(auVar108,auVar102);
    uVar58 = vcmpps_avx512vl(auVar102,auVar109,5);
    bVar46 = (byte)uVar58;
    if (bVar46 == 0) {
LAB_017fbe0f:
      auVar159 = ZEXT3264(_DAT_01f7b040);
    }
    else {
      local_7c0._0_32_ = auVar105;
      auVar102 = vsqrtps_avx512vl(auVar102);
      local_880 = vaddps_avx512vl(auVar100,auVar100);
      local_8a0 = vrcp14ps_avx512vl(local_880);
      auVar109._8_4_ = 0x3f800000;
      auVar109._0_8_ = 0x3f8000003f800000;
      auVar109._12_4_ = 0x3f800000;
      auVar109._16_4_ = 0x3f800000;
      auVar109._20_4_ = 0x3f800000;
      auVar109._24_4_ = 0x3f800000;
      auVar109._28_4_ = 0x3f800000;
      auVar109 = vfnmadd213ps_avx512vl(local_8a0,local_880,auVar109);
      auVar109 = vfmadd132ps_avx512vl(auVar109,local_8a0,local_8a0);
      auVar110._8_4_ = 0x80000000;
      auVar110._0_8_ = 0x8000000080000000;
      auVar110._12_4_ = 0x80000000;
      auVar110._16_4_ = 0x80000000;
      auVar110._20_4_ = 0x80000000;
      auVar110._24_4_ = 0x80000000;
      auVar110._28_4_ = 0x80000000;
      local_8c0 = vxorps_avx512vl(auVar107,auVar110);
      auVar110 = vsubps_avx512vl(local_8c0,auVar102);
      auVar110 = vmulps_avx512vl(auVar110,auVar109);
      auVar102 = vsubps_avx512vl(auVar102,auVar107);
      local_a00 = vmulps_avx512vl(auVar102,auVar109);
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar109 = vblendmps_avx512vl(auVar102,auVar110);
      auVar111._0_4_ =
           (uint)(bVar46 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar46 & 1) * auVar102._0_4_;
      bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar111._4_4_ = (uint)bVar57 * auVar109._4_4_ | (uint)!bVar57 * auVar102._4_4_;
      bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar111._8_4_ = (uint)bVar57 * auVar109._8_4_ | (uint)!bVar57 * auVar102._8_4_;
      bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar111._12_4_ = (uint)bVar57 * auVar109._12_4_ | (uint)!bVar57 * auVar102._12_4_;
      bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar111._16_4_ = (uint)bVar57 * auVar109._16_4_ | (uint)!bVar57 * auVar102._16_4_;
      bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar111._20_4_ = (uint)bVar57 * auVar109._20_4_ | (uint)!bVar57 * auVar102._20_4_;
      bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar111._24_4_ = (uint)bVar57 * auVar109._24_4_ | (uint)!bVar57 * auVar102._24_4_;
      bVar57 = SUB81(uVar58 >> 7,0);
      auVar111._28_4_ = (uint)bVar57 * auVar109._28_4_ | (uint)!bVar57 * auVar102._28_4_;
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar109 = vblendmps_avx512vl(auVar102,local_a00);
      auVar112._0_4_ =
           (uint)(bVar46 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar46 & 1) * auVar102._0_4_;
      bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar112._4_4_ = (uint)bVar57 * auVar109._4_4_ | (uint)!bVar57 * auVar102._4_4_;
      bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar112._8_4_ = (uint)bVar57 * auVar109._8_4_ | (uint)!bVar57 * auVar102._8_4_;
      bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar112._12_4_ = (uint)bVar57 * auVar109._12_4_ | (uint)!bVar57 * auVar102._12_4_;
      bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar112._16_4_ = (uint)bVar57 * auVar109._16_4_ | (uint)!bVar57 * auVar102._16_4_;
      bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar112._20_4_ = (uint)bVar57 * auVar109._20_4_ | (uint)!bVar57 * auVar102._20_4_;
      bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar112._24_4_ = (uint)bVar57 * auVar109._24_4_ | (uint)!bVar57 * auVar102._24_4_;
      bVar57 = SUB81(uVar58 >> 7,0);
      auVar112._28_4_ = (uint)bVar57 * auVar109._28_4_ | (uint)!bVar57 * auVar102._28_4_;
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar90,auVar102);
      local_a20 = vmaxps_avx512vl(local_5a0,auVar102);
      auVar116._8_4_ = 0x36000000;
      auVar116._0_8_ = 0x3600000036000000;
      auVar116._12_4_ = 0x36000000;
      auVar116._16_4_ = 0x36000000;
      auVar116._20_4_ = 0x36000000;
      auVar116._24_4_ = 0x36000000;
      auVar116._28_4_ = 0x36000000;
      local_8e0 = vmulps_avx512vl(local_a20,auVar116);
      vandps_avx512vl(auVar100,auVar102);
      uVar54 = vcmpps_avx512vl(local_8e0,local_8e0,1);
      uVar58 = uVar58 & uVar54;
      bVar53 = (byte)uVar58;
      if (bVar53 != 0) {
        uVar54 = vcmpps_avx512vl(auVar84,_DAT_01f7b000,2);
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar100 = vblendmps_avx512vl(auVar84,auVar90);
        bVar52 = (byte)uVar54;
        uVar59 = (uint)(bVar52 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar52 & 1) * local_8e0._0_4_;
        bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
        uVar133 = (uint)bVar57 * auVar100._4_4_ | (uint)!bVar57 * local_8e0._4_4_;
        bVar57 = (bool)((byte)(uVar54 >> 2) & 1);
        uVar134 = (uint)bVar57 * auVar100._8_4_ | (uint)!bVar57 * local_8e0._8_4_;
        bVar57 = (bool)((byte)(uVar54 >> 3) & 1);
        uVar135 = (uint)bVar57 * auVar100._12_4_ | (uint)!bVar57 * local_8e0._12_4_;
        bVar57 = (bool)((byte)(uVar54 >> 4) & 1);
        uVar136 = (uint)bVar57 * auVar100._16_4_ | (uint)!bVar57 * local_8e0._16_4_;
        bVar57 = (bool)((byte)(uVar54 >> 5) & 1);
        uVar137 = (uint)bVar57 * auVar100._20_4_ | (uint)!bVar57 * local_8e0._20_4_;
        bVar57 = (bool)((byte)(uVar54 >> 6) & 1);
        uVar138 = (uint)bVar57 * auVar100._24_4_ | (uint)!bVar57 * local_8e0._24_4_;
        bVar57 = SUB81(uVar54 >> 7,0);
        uVar139 = (uint)bVar57 * auVar100._28_4_ | (uint)!bVar57 * local_8e0._28_4_;
        auVar111._0_4_ = (bVar53 & 1) * uVar59 | !(bool)(bVar53 & 1) * auVar111._0_4_;
        bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar111._4_4_ = bVar57 * uVar133 | !bVar57 * auVar111._4_4_;
        bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar111._8_4_ = bVar57 * uVar134 | !bVar57 * auVar111._8_4_;
        bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar111._12_4_ = bVar57 * uVar135 | !bVar57 * auVar111._12_4_;
        bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar111._16_4_ = bVar57 * uVar136 | !bVar57 * auVar111._16_4_;
        bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar111._20_4_ = bVar57 * uVar137 | !bVar57 * auVar111._20_4_;
        bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar111._24_4_ = bVar57 * uVar138 | !bVar57 * auVar111._24_4_;
        bVar57 = SUB81(uVar58 >> 7,0);
        auVar111._28_4_ = bVar57 * uVar139 | !bVar57 * auVar111._28_4_;
        auVar84 = vblendmps_avx512vl(auVar90,auVar84);
        bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar54 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar54 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar54 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar54 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar54 >> 6) & 1);
        bVar10 = SUB81(uVar54 >> 7,0);
        auVar112._0_4_ =
             (uint)(bVar53 & 1) *
             ((uint)(bVar52 & 1) * auVar84._0_4_ | !(bool)(bVar52 & 1) * uVar59) |
             !(bool)(bVar53 & 1) * auVar112._0_4_;
        bVar4 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar112._4_4_ =
             (uint)bVar4 * ((uint)bVar57 * auVar84._4_4_ | !bVar57 * uVar133) |
             !bVar4 * auVar112._4_4_;
        bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar112._8_4_ =
             (uint)bVar57 * ((uint)bVar5 * auVar84._8_4_ | !bVar5 * uVar134) |
             !bVar57 * auVar112._8_4_;
        bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar112._12_4_ =
             (uint)bVar57 * ((uint)bVar6 * auVar84._12_4_ | !bVar6 * uVar135) |
             !bVar57 * auVar112._12_4_;
        bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar112._16_4_ =
             (uint)bVar57 * ((uint)bVar7 * auVar84._16_4_ | !bVar7 * uVar136) |
             !bVar57 * auVar112._16_4_;
        bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar112._20_4_ =
             (uint)bVar57 * ((uint)bVar8 * auVar84._20_4_ | !bVar8 * uVar137) |
             !bVar57 * auVar112._20_4_;
        bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar112._24_4_ =
             (uint)bVar57 * ((uint)bVar9 * auVar84._24_4_ | !bVar9 * uVar138) |
             !bVar57 * auVar112._24_4_;
        bVar57 = SUB81(uVar58 >> 7,0);
        auVar112._28_4_ =
             (uint)bVar57 * ((uint)bVar10 * auVar84._28_4_ | !bVar10 * uVar139) |
             !bVar57 * auVar112._28_4_;
        bVar46 = (~bVar53 | bVar52) & bVar46;
      }
      if ((bVar46 & 0x7f) == 0) goto LAB_017fbe0f;
      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar90 = vxorps_avx512vl(auVar99,auVar84);
      auVar100 = vxorps_avx512vl(auVar97,auVar84);
      auVar159 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
      auVar102 = vxorps_avx512vl(auVar98,auVar84);
      auVar60 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x200)),
                               ZEXT416((uint)local_930._0_4_));
      auVar97 = vbroadcastss_avx512vl(auVar60);
      auVar97 = vminps_avx512vl(auVar97,auVar112);
      auVar45._4_4_ = fStack_65c;
      auVar45._0_4_ = local_660;
      auVar45._8_4_ = fStack_658;
      auVar45._12_4_ = fStack_654;
      auVar45._16_4_ = fStack_650;
      auVar45._20_4_ = fStack_64c;
      auVar45._24_4_ = fStack_648;
      auVar45._28_4_ = fStack_644;
      auVar98 = vmaxps_avx512vl(auVar45,auVar111);
      auVar99 = vmulps_avx512vl(auVar104,auVar115);
      auVar99 = vfmadd213ps_avx512vl(auVar103,auVar114,auVar99);
      auVar60 = vfmadd213ps_fma(auVar101,auVar113,auVar99);
      auVar101 = vmulps_avx512vl(local_840,auVar115);
      auVar101 = vfmadd231ps_avx512vl(auVar101,local_820,auVar114);
      auVar101 = vfmadd231ps_avx512vl(auVar101,local_800,auVar113);
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar101,auVar99);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar12 = vcmpps_avx512vl(auVar99,auVar113,1);
      auVar114 = vxorps_avx512vl(ZEXT1632(auVar60),auVar84);
      auVar115 = vrcp14ps_avx512vl(auVar101);
      auVar103 = vxorps_avx512vl(auVar101,auVar84);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar109 = vfnmadd213ps_avx512vl(auVar115,auVar101,auVar104);
      auVar60 = vfmadd132ps_fma(auVar109,auVar115,auVar115);
      fVar225 = auVar60._0_4_ * auVar114._0_4_;
      fVar200 = auVar60._4_4_ * auVar114._4_4_;
      auVar30._4_4_ = fVar200;
      auVar30._0_4_ = fVar225;
      fVar219 = auVar60._8_4_ * auVar114._8_4_;
      auVar30._8_4_ = fVar219;
      fVar220 = auVar60._12_4_ * auVar114._12_4_;
      auVar30._12_4_ = fVar220;
      fVar221 = auVar114._16_4_ * 0.0;
      auVar30._16_4_ = fVar221;
      fVar222 = auVar114._20_4_ * 0.0;
      auVar30._20_4_ = fVar222;
      fVar223 = auVar114._24_4_ * 0.0;
      auVar30._24_4_ = fVar223;
      auVar30._28_4_ = auVar114._28_4_;
      uVar14 = vcmpps_avx512vl(auVar101,auVar103,1);
      bVar53 = (byte)uVar12 | (byte)uVar14;
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar116 = vblendmps_avx512vl(auVar30,auVar109);
      auVar117._0_4_ =
           (uint)(bVar53 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar115._0_4_;
      bVar57 = (bool)(bVar53 >> 1 & 1);
      auVar117._4_4_ = (uint)bVar57 * auVar116._4_4_ | (uint)!bVar57 * auVar115._4_4_;
      bVar57 = (bool)(bVar53 >> 2 & 1);
      auVar117._8_4_ = (uint)bVar57 * auVar116._8_4_ | (uint)!bVar57 * auVar115._8_4_;
      bVar57 = (bool)(bVar53 >> 3 & 1);
      auVar117._12_4_ = (uint)bVar57 * auVar116._12_4_ | (uint)!bVar57 * auVar115._12_4_;
      bVar57 = (bool)(bVar53 >> 4 & 1);
      auVar117._16_4_ = (uint)bVar57 * auVar116._16_4_ | (uint)!bVar57 * auVar115._16_4_;
      bVar57 = (bool)(bVar53 >> 5 & 1);
      auVar117._20_4_ = (uint)bVar57 * auVar116._20_4_ | (uint)!bVar57 * auVar115._20_4_;
      bVar57 = (bool)(bVar53 >> 6 & 1);
      auVar117._24_4_ = (uint)bVar57 * auVar116._24_4_ | (uint)!bVar57 * auVar115._24_4_;
      auVar117._28_4_ =
           (uint)(bVar53 >> 7) * auVar116._28_4_ | (uint)!(bool)(bVar53 >> 7) * auVar115._28_4_;
      auVar115 = vmaxps_avx512vl(auVar98,auVar117);
      uVar14 = vcmpps_avx512vl(auVar101,auVar103,6);
      bVar53 = (byte)uVar12 | (byte)uVar14;
      auVar118._0_4_ = (uint)(bVar53 & 1) * 0x7f800000 | (uint)!(bool)(bVar53 & 1) * (int)fVar225;
      bVar57 = (bool)(bVar53 >> 1 & 1);
      auVar118._4_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar200;
      bVar57 = (bool)(bVar53 >> 2 & 1);
      auVar118._8_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar219;
      bVar57 = (bool)(bVar53 >> 3 & 1);
      auVar118._12_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar220;
      bVar57 = (bool)(bVar53 >> 4 & 1);
      auVar118._16_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar221;
      bVar57 = (bool)(bVar53 >> 5 & 1);
      auVar118._20_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar222;
      bVar57 = (bool)(bVar53 >> 6 & 1);
      auVar118._24_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar223;
      auVar118._28_4_ =
           (uint)(bVar53 >> 7) * 0x7f800000 | (uint)!(bool)(bVar53 >> 7) * auVar114._28_4_;
      auVar101 = vminps_avx512vl(auVar97,auVar118);
      auVar60 = vxorps_avx512vl(auVar98._0_16_,auVar98._0_16_);
      auVar94 = vsubps_avx512vl(ZEXT1632(auVar60),auVar94);
      auVar95 = vsubps_avx512vl(ZEXT1632(auVar60),auVar95);
      auVar97 = ZEXT1632(auVar60);
      auVar96 = vsubps_avx512vl(auVar97,auVar96);
      auVar96 = vmulps_avx512vl(auVar96,auVar90);
      auVar95 = vfmadd231ps_avx512vl(auVar96,auVar102,auVar95);
      auVar94 = vfmadd231ps_avx512vl(auVar95,auVar100,auVar94);
      auVar90 = vmulps_avx512vl(local_840,auVar90);
      auVar90 = vfmadd231ps_avx512vl(auVar90,local_820,auVar102);
      auVar90 = vfmadd231ps_avx512vl(auVar90,local_800,auVar100);
      vandps_avx512vl(auVar90,auVar99);
      uVar12 = vcmpps_avx512vl(auVar90,auVar113,1);
      auVar100 = vxorps_avx512vl(auVar94,auVar84);
      auVar102 = vrcp14ps_avx512vl(auVar90);
      auVar94 = vxorps_avx512vl(auVar90,auVar84);
      auVar262 = ZEXT3264(auVar94);
      auVar84 = vfnmadd213ps_avx512vl(auVar102,auVar90,auVar104);
      auVar60 = vfmadd132ps_fma(auVar84,auVar102,auVar102);
      fVar225 = auVar60._0_4_ * auVar100._0_4_;
      fVar200 = auVar60._4_4_ * auVar100._4_4_;
      auVar31._4_4_ = fVar200;
      auVar31._0_4_ = fVar225;
      fVar219 = auVar60._8_4_ * auVar100._8_4_;
      auVar31._8_4_ = fVar219;
      fVar220 = auVar60._12_4_ * auVar100._12_4_;
      auVar31._12_4_ = fVar220;
      fVar221 = auVar100._16_4_ * 0.0;
      auVar31._16_4_ = fVar221;
      fVar222 = auVar100._20_4_ * 0.0;
      auVar31._20_4_ = fVar222;
      fVar223 = auVar100._24_4_ * 0.0;
      auVar31._24_4_ = fVar223;
      auVar31._28_4_ = auVar100._28_4_;
      uVar14 = vcmpps_avx512vl(auVar90,auVar94,1);
      bVar53 = (byte)uVar12 | (byte)uVar14;
      auVar84 = vblendmps_avx512vl(auVar31,auVar109);
      auVar119._0_4_ =
           (uint)(bVar53 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar102._0_4_;
      bVar57 = (bool)(bVar53 >> 1 & 1);
      auVar119._4_4_ = (uint)bVar57 * auVar84._4_4_ | (uint)!bVar57 * auVar102._4_4_;
      bVar57 = (bool)(bVar53 >> 2 & 1);
      auVar119._8_4_ = (uint)bVar57 * auVar84._8_4_ | (uint)!bVar57 * auVar102._8_4_;
      bVar57 = (bool)(bVar53 >> 3 & 1);
      auVar119._12_4_ = (uint)bVar57 * auVar84._12_4_ | (uint)!bVar57 * auVar102._12_4_;
      bVar57 = (bool)(bVar53 >> 4 & 1);
      auVar119._16_4_ = (uint)bVar57 * auVar84._16_4_ | (uint)!bVar57 * auVar102._16_4_;
      bVar57 = (bool)(bVar53 >> 5 & 1);
      auVar119._20_4_ = (uint)bVar57 * auVar84._20_4_ | (uint)!bVar57 * auVar102._20_4_;
      bVar57 = (bool)(bVar53 >> 6 & 1);
      auVar119._24_4_ = (uint)bVar57 * auVar84._24_4_ | (uint)!bVar57 * auVar102._24_4_;
      auVar119._28_4_ =
           (uint)(bVar53 >> 7) * auVar84._28_4_ | (uint)!(bool)(bVar53 >> 7) * auVar102._28_4_;
      auVar84 = vmaxps_avx(auVar115,auVar119);
      auVar261 = ZEXT3264(auVar84);
      uVar14 = vcmpps_avx512vl(auVar90,auVar94,6);
      bVar53 = (byte)uVar12 | (byte)uVar14;
      auVar120._0_4_ = (uint)(bVar53 & 1) * 0x7f800000 | (uint)!(bool)(bVar53 & 1) * (int)fVar225;
      bVar57 = (bool)(bVar53 >> 1 & 1);
      auVar120._4_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar200;
      bVar57 = (bool)(bVar53 >> 2 & 1);
      auVar120._8_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar219;
      bVar57 = (bool)(bVar53 >> 3 & 1);
      auVar120._12_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar220;
      bVar57 = (bool)(bVar53 >> 4 & 1);
      auVar120._16_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar221;
      bVar57 = (bool)(bVar53 >> 5 & 1);
      auVar120._20_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar222;
      bVar57 = (bool)(bVar53 >> 6 & 1);
      auVar120._24_4_ = (uint)bVar57 * 0x7f800000 | (uint)!bVar57 * (int)fVar223;
      auVar120._28_4_ =
           (uint)(bVar53 >> 7) * 0x7f800000 | (uint)!(bool)(bVar53 >> 7) * auVar100._28_4_;
      local_6a0 = vminps_avx(auVar101,auVar120);
      uVar12 = vcmpps_avx512vl(auVar84,local_6a0,2);
      bVar46 = bVar46 & 0x7f & (byte)uVar12;
      if (bVar46 == 0) goto LAB_017fbe0f;
      auVar90 = vmaxps_avx512vl(auVar97,auVar83);
      auVar83 = vfmadd213ps_avx512vl(auVar110,auVar106,auVar89);
      fVar225 = auVar87._0_4_;
      fVar200 = auVar87._4_4_;
      auVar32._4_4_ = fVar200 * auVar83._4_4_;
      auVar32._0_4_ = fVar225 * auVar83._0_4_;
      fVar219 = auVar87._8_4_;
      auVar32._8_4_ = fVar219 * auVar83._8_4_;
      fVar220 = auVar87._12_4_;
      auVar32._12_4_ = fVar220 * auVar83._12_4_;
      fVar221 = auVar87._16_4_;
      auVar32._16_4_ = fVar221 * auVar83._16_4_;
      fVar222 = auVar87._20_4_;
      auVar32._20_4_ = fVar222 * auVar83._20_4_;
      fVar223 = auVar87._24_4_;
      auVar32._24_4_ = fVar223 * auVar83._24_4_;
      auVar32._28_4_ = auVar83._28_4_;
      auVar83 = vfmadd213ps_avx512vl(local_a00,auVar106,auVar89);
      auVar33._4_4_ = fVar200 * auVar83._4_4_;
      auVar33._0_4_ = fVar225 * auVar83._0_4_;
      auVar33._8_4_ = fVar219 * auVar83._8_4_;
      auVar33._12_4_ = fVar220 * auVar83._12_4_;
      auVar33._16_4_ = fVar221 * auVar83._16_4_;
      auVar33._20_4_ = fVar222 * auVar83._20_4_;
      auVar33._24_4_ = fVar223 * auVar83._24_4_;
      auVar33._28_4_ = auVar83._28_4_;
      auVar83 = vminps_avx512vl(auVar32,auVar104);
      auVar100 = ZEXT832(0) << 0x20;
      auVar83 = vmaxps_avx(auVar83,ZEXT832(0) << 0x20);
      auVar101 = vminps_avx512vl(auVar33,auVar104);
      auVar34._4_4_ = (auVar83._4_4_ + 1.0) * 0.125;
      auVar34._0_4_ = (auVar83._0_4_ + 0.0) * 0.125;
      auVar34._8_4_ = (auVar83._8_4_ + 2.0) * 0.125;
      auVar34._12_4_ = (auVar83._12_4_ + 3.0) * 0.125;
      auVar34._16_4_ = (auVar83._16_4_ + 4.0) * 0.125;
      auVar34._20_4_ = (auVar83._20_4_ + 5.0) * 0.125;
      auVar34._24_4_ = (auVar83._24_4_ + 6.0) * 0.125;
      auVar34._28_4_ = auVar83._28_4_ + 7.0;
      local_520 = vfmadd213ps_avx512vl(auVar34,auVar151,auVar230);
      auVar83 = vmaxps_avx(auVar101,ZEXT832(0) << 0x20);
      auVar35._4_4_ = (auVar83._4_4_ + 1.0) * 0.125;
      auVar35._0_4_ = (auVar83._0_4_ + 0.0) * 0.125;
      auVar35._8_4_ = (auVar83._8_4_ + 2.0) * 0.125;
      auVar35._12_4_ = (auVar83._12_4_ + 3.0) * 0.125;
      auVar35._16_4_ = (auVar83._16_4_ + 4.0) * 0.125;
      auVar35._20_4_ = (auVar83._20_4_ + 5.0) * 0.125;
      auVar35._24_4_ = (auVar83._24_4_ + 6.0) * 0.125;
      auVar35._28_4_ = auVar83._28_4_ + 7.0;
      local_540 = vfmadd213ps_avx512vl(auVar35,auVar151,auVar230);
      auVar36._4_4_ = auVar90._4_4_ * auVar90._4_4_;
      auVar36._0_4_ = auVar90._0_4_ * auVar90._0_4_;
      auVar36._8_4_ = auVar90._8_4_ * auVar90._8_4_;
      auVar36._12_4_ = auVar90._12_4_ * auVar90._12_4_;
      auVar36._16_4_ = auVar90._16_4_ * auVar90._16_4_;
      auVar36._20_4_ = auVar90._20_4_ * auVar90._20_4_;
      auVar36._24_4_ = auVar90._24_4_ * auVar90._24_4_;
      auVar36._28_4_ = auVar90._28_4_;
      auVar83 = vsubps_avx(auVar105,auVar36);
      auVar37._4_4_ = auVar83._4_4_ * (float)local_860._4_4_;
      auVar37._0_4_ = auVar83._0_4_ * (float)local_860._0_4_;
      auVar37._8_4_ = auVar83._8_4_ * fStack_858;
      auVar37._12_4_ = auVar83._12_4_ * fStack_854;
      auVar37._16_4_ = auVar83._16_4_ * fStack_850;
      auVar37._20_4_ = auVar83._20_4_ * fStack_84c;
      auVar37._24_4_ = auVar83._24_4_ * fStack_848;
      auVar37._28_4_ = auVar90._28_4_;
      auVar90 = vsubps_avx(auVar108,auVar37);
      uVar12 = vcmpps_avx512vl(auVar90,ZEXT832(0) << 0x20,5);
      bVar53 = (byte)uVar12;
      if (bVar53 == 0) {
        bVar53 = 0;
        auVar85 = ZEXT832(0) << 0x20;
        auVar251 = ZEXT864(0) << 0x20;
        auVar90 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar101 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar261 = ZEXT864(0) << 0x20;
        auVar108._8_4_ = 0x7f800000;
        auVar108._0_8_ = 0x7f8000007f800000;
        auVar108._12_4_ = 0x7f800000;
        auVar108._16_4_ = 0x7f800000;
        auVar108._20_4_ = 0x7f800000;
        auVar108._24_4_ = 0x7f800000;
        auVar108._28_4_ = 0x7f800000;
        auVar121._8_4_ = 0xff800000;
        auVar121._0_8_ = 0xff800000ff800000;
        auVar121._12_4_ = 0xff800000;
        auVar121._16_4_ = 0xff800000;
        auVar121._20_4_ = 0xff800000;
        auVar121._24_4_ = 0xff800000;
        auVar121._28_4_ = 0xff800000;
      }
      else {
        auVar67 = vxorps_avx512vl(auVar142,auVar142);
        uVar58 = vcmpps_avx512vl(auVar90,auVar97,5);
        auVar90 = vsqrtps_avx(auVar90);
        auVar100 = vfnmadd213ps_avx512vl(local_880,local_8a0,auVar104);
        auVar60 = vfmadd132ps_fma(auVar100,local_8a0,local_8a0);
        auVar100 = vsubps_avx(local_8c0,auVar90);
        auVar38._4_4_ = auVar60._4_4_ * auVar100._4_4_;
        auVar38._0_4_ = auVar60._0_4_ * auVar100._0_4_;
        auVar38._8_4_ = auVar60._8_4_ * auVar100._8_4_;
        auVar38._12_4_ = auVar60._12_4_ * auVar100._12_4_;
        auVar38._16_4_ = auVar100._16_4_ * 0.0;
        auVar38._20_4_ = auVar100._20_4_ * 0.0;
        auVar38._24_4_ = auVar100._24_4_ * 0.0;
        auVar38._28_4_ = 0x3e000000;
        auVar90 = vsubps_avx512vl(auVar90,auVar107);
        auVar39._4_4_ = auVar60._4_4_ * auVar90._4_4_;
        auVar39._0_4_ = auVar60._0_4_ * auVar90._0_4_;
        auVar39._8_4_ = auVar60._8_4_ * auVar90._8_4_;
        auVar39._12_4_ = auVar60._12_4_ * auVar90._12_4_;
        auVar39._16_4_ = auVar90._16_4_ * 0.0;
        auVar39._20_4_ = auVar90._20_4_ * 0.0;
        auVar39._24_4_ = auVar90._24_4_ * 0.0;
        auVar39._28_4_ = uVar161;
        auVar90 = vfmadd213ps_avx512vl(auVar106,auVar38,auVar89);
        auVar260._0_4_ = fVar225 * auVar90._0_4_;
        auVar260._4_4_ = fVar200 * auVar90._4_4_;
        auVar260._8_4_ = fVar219 * auVar90._8_4_;
        auVar260._12_4_ = fVar220 * auVar90._12_4_;
        auVar260._16_4_ = fVar221 * auVar90._16_4_;
        auVar260._20_4_ = fVar222 * auVar90._20_4_;
        auVar260._24_4_ = fVar223 * auVar90._24_4_;
        auVar260._28_4_ = 0;
        auVar90 = vmulps_avx512vl(local_800,auVar38);
        auVar100 = vmulps_avx512vl(local_820,auVar38);
        auVar102 = vmulps_avx512vl(local_840,auVar38);
        auVar101 = vfmadd213ps_avx512vl(auVar85,auVar260,auVar91);
        auVar90 = vsubps_avx512vl(auVar90,auVar101);
        auVar101 = vfmadd213ps_avx512vl(auVar86,auVar260,auVar92);
        auVar101 = vsubps_avx512vl(auVar100,auVar101);
        auVar60 = vfmadd213ps_fma(auVar260,auVar88,auVar93);
        auVar100 = vsubps_avx(auVar102,ZEXT1632(auVar60));
        auVar261 = ZEXT3264(auVar100);
        auVar89 = vfmadd213ps_avx512vl(auVar106,auVar39,auVar89);
        auVar87 = vmulps_avx512vl(auVar87,auVar89);
        auVar89 = vmulps_avx512vl(local_800,auVar39);
        auVar102 = vmulps_avx512vl(local_820,auVar39);
        auVar94 = vmulps_avx512vl(local_840,auVar39);
        auVar60 = vfmadd213ps_fma(auVar85,auVar87,auVar91);
        auVar100 = vsubps_avx(auVar89,ZEXT1632(auVar60));
        auVar60 = vfmadd213ps_fma(auVar86,auVar87,auVar92);
        auVar85 = vsubps_avx512vl(auVar102,ZEXT1632(auVar60));
        auVar60 = vfmadd213ps_fma(auVar88,auVar87,auVar93);
        auVar86 = vsubps_avx512vl(auVar94,ZEXT1632(auVar60));
        auVar251 = ZEXT3264(auVar86);
        auVar152._8_4_ = 0x7f800000;
        auVar152._0_8_ = 0x7f8000007f800000;
        auVar152._12_4_ = 0x7f800000;
        auVar152._16_4_ = 0x7f800000;
        auVar152._20_4_ = 0x7f800000;
        auVar152._24_4_ = 0x7f800000;
        auVar152._28_4_ = 0x7f800000;
        auVar86 = vblendmps_avx512vl(auVar152,auVar38);
        bVar57 = (bool)((byte)uVar58 & 1);
        auVar108._0_4_ = (uint)bVar57 * auVar86._0_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar108._4_4_ = (uint)bVar57 * auVar86._4_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar108._8_4_ = (uint)bVar57 * auVar86._8_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar108._12_4_ = (uint)bVar57 * auVar86._12_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar108._16_4_ = (uint)bVar57 * auVar86._16_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar108._20_4_ = (uint)bVar57 * auVar86._20_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar108._24_4_ = (uint)bVar57 * auVar86._24_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = SUB81(uVar58 >> 7,0);
        auVar108._28_4_ = (uint)bVar57 * auVar86._28_4_ | (uint)!bVar57 * 0x7f800000;
        auVar197._8_4_ = 0xff800000;
        auVar197._0_8_ = 0xff800000ff800000;
        auVar197._12_4_ = 0xff800000;
        auVar197._16_4_ = 0xff800000;
        auVar197._20_4_ = 0xff800000;
        auVar197._24_4_ = 0xff800000;
        auVar197._28_4_ = 0xff800000;
        auVar86 = vblendmps_avx512vl(auVar197,auVar39);
        bVar57 = (bool)((byte)uVar58 & 1);
        auVar121._0_4_ = (uint)bVar57 * auVar86._0_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar57 * auVar86._4_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar57 * auVar86._8_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar57 * auVar86._12_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar121._16_4_ = (uint)bVar57 * auVar86._16_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar121._20_4_ = (uint)bVar57 * auVar86._20_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar121._24_4_ = (uint)bVar57 * auVar86._24_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = SUB81(uVar58 >> 7,0);
        auVar121._28_4_ = (uint)bVar57 * auVar86._28_4_ | (uint)!bVar57 * -0x800000;
        auVar26._8_4_ = 0x36000000;
        auVar26._0_8_ = 0x3600000036000000;
        auVar26._12_4_ = 0x36000000;
        auVar26._16_4_ = 0x36000000;
        auVar26._20_4_ = 0x36000000;
        auVar26._24_4_ = 0x36000000;
        auVar26._28_4_ = 0x36000000;
        auVar86 = vmulps_avx512vl(local_a20,auVar26);
        uVar54 = vcmpps_avx512vl(auVar86,local_8e0,0xe);
        uVar58 = uVar58 & uVar54;
        bVar52 = (byte)uVar58;
        if (bVar52 != 0) {
          uVar54 = vcmpps_avx512vl(auVar83,ZEXT1632(auVar67),2);
          auVar255._8_4_ = 0x7f800000;
          auVar255._0_8_ = 0x7f8000007f800000;
          auVar255._12_4_ = 0x7f800000;
          auVar255._16_4_ = 0x7f800000;
          auVar255._20_4_ = 0x7f800000;
          auVar255._24_4_ = 0x7f800000;
          auVar255._28_4_ = 0x7f800000;
          auVar266._8_4_ = 0xff800000;
          auVar266._0_8_ = 0xff800000ff800000;
          auVar266._12_4_ = 0xff800000;
          auVar266._16_4_ = 0xff800000;
          auVar266._20_4_ = 0xff800000;
          auVar266._24_4_ = 0xff800000;
          auVar266._28_4_ = 0xff800000;
          auVar83 = vblendmps_avx512vl(auVar255,auVar266);
          bVar47 = (byte)uVar54;
          uVar59 = (uint)(bVar47 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar47 & 1) * auVar86._0_4_;
          bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
          uVar133 = (uint)bVar57 * auVar83._4_4_ | (uint)!bVar57 * auVar86._4_4_;
          bVar57 = (bool)((byte)(uVar54 >> 2) & 1);
          uVar134 = (uint)bVar57 * auVar83._8_4_ | (uint)!bVar57 * auVar86._8_4_;
          bVar57 = (bool)((byte)(uVar54 >> 3) & 1);
          uVar135 = (uint)bVar57 * auVar83._12_4_ | (uint)!bVar57 * auVar86._12_4_;
          bVar57 = (bool)((byte)(uVar54 >> 4) & 1);
          uVar136 = (uint)bVar57 * auVar83._16_4_ | (uint)!bVar57 * auVar86._16_4_;
          bVar57 = (bool)((byte)(uVar54 >> 5) & 1);
          uVar137 = (uint)bVar57 * auVar83._20_4_ | (uint)!bVar57 * auVar86._20_4_;
          bVar57 = (bool)((byte)(uVar54 >> 6) & 1);
          uVar138 = (uint)bVar57 * auVar83._24_4_ | (uint)!bVar57 * auVar86._24_4_;
          bVar57 = SUB81(uVar54 >> 7,0);
          uVar139 = (uint)bVar57 * auVar83._28_4_ | (uint)!bVar57 * auVar86._28_4_;
          auVar108._0_4_ = (bVar52 & 1) * uVar59 | !(bool)(bVar52 & 1) * auVar108._0_4_;
          bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar108._4_4_ = bVar57 * uVar133 | !bVar57 * auVar108._4_4_;
          bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
          auVar108._8_4_ = bVar57 * uVar134 | !bVar57 * auVar108._8_4_;
          bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
          auVar108._12_4_ = bVar57 * uVar135 | !bVar57 * auVar108._12_4_;
          bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
          auVar108._16_4_ = bVar57 * uVar136 | !bVar57 * auVar108._16_4_;
          bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
          auVar108._20_4_ = bVar57 * uVar137 | !bVar57 * auVar108._20_4_;
          bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
          auVar108._24_4_ = bVar57 * uVar138 | !bVar57 * auVar108._24_4_;
          bVar57 = SUB81(uVar58 >> 7,0);
          auVar108._28_4_ = bVar57 * uVar139 | !bVar57 * auVar108._28_4_;
          auVar83 = vblendmps_avx512vl(auVar266,auVar255);
          bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
          bVar5 = (bool)((byte)(uVar54 >> 2) & 1);
          bVar6 = (bool)((byte)(uVar54 >> 3) & 1);
          bVar7 = (bool)((byte)(uVar54 >> 4) & 1);
          bVar8 = (bool)((byte)(uVar54 >> 5) & 1);
          bVar9 = (bool)((byte)(uVar54 >> 6) & 1);
          bVar10 = SUB81(uVar54 >> 7,0);
          auVar121._0_4_ =
               (uint)(bVar52 & 1) *
               ((uint)(bVar47 & 1) * auVar83._0_4_ | !(bool)(bVar47 & 1) * uVar59) |
               !(bool)(bVar52 & 1) * auVar121._0_4_;
          bVar4 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar121._4_4_ =
               (uint)bVar4 * ((uint)bVar57 * auVar83._4_4_ | !bVar57 * uVar133) |
               !bVar4 * auVar121._4_4_;
          bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
          auVar121._8_4_ =
               (uint)bVar57 * ((uint)bVar5 * auVar83._8_4_ | !bVar5 * uVar134) |
               !bVar57 * auVar121._8_4_;
          bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
          auVar121._12_4_ =
               (uint)bVar57 * ((uint)bVar6 * auVar83._12_4_ | !bVar6 * uVar135) |
               !bVar57 * auVar121._12_4_;
          bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
          auVar121._16_4_ =
               (uint)bVar57 * ((uint)bVar7 * auVar83._16_4_ | !bVar7 * uVar136) |
               !bVar57 * auVar121._16_4_;
          bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
          auVar121._20_4_ =
               (uint)bVar57 * ((uint)bVar8 * auVar83._20_4_ | !bVar8 * uVar137) |
               !bVar57 * auVar121._20_4_;
          bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
          auVar121._24_4_ =
               (uint)bVar57 * ((uint)bVar9 * auVar83._24_4_ | !bVar9 * uVar138) |
               !bVar57 * auVar121._24_4_;
          bVar57 = SUB81(uVar58 >> 7,0);
          auVar121._28_4_ =
               (uint)bVar57 * ((uint)bVar10 * auVar83._28_4_ | !bVar10 * uVar139) |
               !bVar57 * auVar121._28_4_;
          bVar53 = (~bVar52 | bVar47) & bVar53;
        }
      }
      auVar256._0_4_ = local_840._0_4_ * auVar251._0_4_;
      auVar256._4_4_ = local_840._4_4_ * auVar251._4_4_;
      auVar256._8_4_ = local_840._8_4_ * auVar251._8_4_;
      auVar256._12_4_ = local_840._12_4_ * auVar251._12_4_;
      auVar256._16_4_ = local_840._16_4_ * auVar251._16_4_;
      auVar256._20_4_ = local_840._20_4_ * auVar251._20_4_;
      auVar256._28_36_ = auVar251._28_36_;
      auVar256._24_4_ = local_840._24_4_ * auVar251._24_4_;
      auVar60 = vfmadd231ps_fma(auVar256._0_32_,local_820,auVar85);
      auVar256 = ZEXT3264(local_800);
      auVar60 = vfmadd231ps_fma(ZEXT1632(auVar60),local_800,auVar100);
      auVar250._8_4_ = 0x7fffffff;
      auVar250._0_8_ = 0x7fffffff7fffffff;
      auVar250._12_4_ = 0x7fffffff;
      auVar250._16_4_ = 0x7fffffff;
      auVar250._20_4_ = 0x7fffffff;
      auVar250._24_4_ = 0x7fffffff;
      auVar250._28_4_ = 0x7fffffff;
      auVar251 = ZEXT3264(auVar250);
      auVar83 = vandps_avx(ZEXT1632(auVar60),auVar250);
      auVar262 = ZEXT3264(auVar84);
      _local_440 = auVar84;
      auVar242._8_4_ = 0x3e99999a;
      auVar242._0_8_ = 0x3e99999a3e99999a;
      auVar242._12_4_ = 0x3e99999a;
      auVar242._16_4_ = 0x3e99999a;
      auVar242._20_4_ = 0x3e99999a;
      auVar242._24_4_ = 0x3e99999a;
      auVar242._28_4_ = 0x3e99999a;
      uVar12 = vcmpps_avx512vl(auVar83,auVar242,1);
      _local_740 = vmaxps_avx(auVar84,auVar121);
      auVar83 = vminps_avx(local_6a0,auVar108);
      uVar14 = vcmpps_avx512vl(auVar84,auVar83,2);
      bVar52 = (byte)uVar14 & bVar46;
      uVar13 = vcmpps_avx512vl(_local_740,local_6a0,2);
      if ((bVar46 & ((byte)uVar13 | (byte)uVar14)) != 0) {
        bVar47 = (byte)uVar12 | ~bVar53;
        auVar40._4_4_ = local_840._4_4_ * auVar261._4_4_;
        auVar40._0_4_ = local_840._0_4_ * auVar261._0_4_;
        auVar40._8_4_ = local_840._8_4_ * auVar261._8_4_;
        auVar40._12_4_ = local_840._12_4_ * auVar261._12_4_;
        auVar40._16_4_ = local_840._16_4_ * auVar261._16_4_;
        auVar40._20_4_ = local_840._20_4_ * auVar261._20_4_;
        auVar40._24_4_ = local_840._24_4_ * auVar261._24_4_;
        auVar40._28_4_ = auVar83._28_4_;
        auVar60 = vfmadd213ps_fma(auVar101,local_820,auVar40);
        auVar60 = vfmadd213ps_fma(auVar90,local_800,ZEXT1632(auVar60));
        auVar83 = vandps_avx(ZEXT1632(auVar60),auVar250);
        uVar12 = vcmpps_avx512vl(auVar83,auVar242,1);
        bVar53 = (byte)uVar12 | ~bVar53;
        auVar153._8_4_ = 2;
        auVar153._0_8_ = 0x200000002;
        auVar153._12_4_ = 2;
        auVar153._16_4_ = 2;
        auVar153._20_4_ = 2;
        auVar153._24_4_ = 2;
        auVar153._28_4_ = 2;
        auVar27._8_4_ = 3;
        auVar27._0_8_ = 0x300000003;
        auVar27._12_4_ = 3;
        auVar27._16_4_ = 3;
        auVar27._20_4_ = 3;
        auVar27._24_4_ = 3;
        auVar27._28_4_ = 3;
        auVar83 = vpblendmd_avx512vl(auVar153,auVar27);
        local_680._0_4_ = (uint)(bVar53 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar53 & 1) * 2;
        bVar57 = (bool)(bVar53 >> 1 & 1);
        local_680._4_4_ = (uint)bVar57 * auVar83._4_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)(bVar53 >> 2 & 1);
        local_680._8_4_ = (uint)bVar57 * auVar83._8_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)(bVar53 >> 3 & 1);
        local_680._12_4_ = (uint)bVar57 * auVar83._12_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)(bVar53 >> 4 & 1);
        local_680._16_4_ = (uint)bVar57 * auVar83._16_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)(bVar53 >> 5 & 1);
        local_680._20_4_ = (uint)bVar57 * auVar83._20_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)(bVar53 >> 6 & 1);
        local_680._24_4_ = (uint)bVar57 * auVar83._24_4_ | (uint)!bVar57 * 2;
        local_680._28_4_ = (uint)(bVar53 >> 7) * auVar83._28_4_ | (uint)!(bool)(bVar53 >> 7) * 2;
        local_6e0 = vpbroadcastd_avx512vl();
        uVar12 = vpcmpd_avx512vl(local_6e0,local_680,5);
        local_720 = auVar84._0_4_ + (float)local_7e0._0_4_;
        fStack_71c = auVar84._4_4_ + (float)local_7e0._4_4_;
        fStack_718 = auVar84._8_4_ + fStack_7d8;
        fStack_714 = auVar84._12_4_ + fStack_7d4;
        fStack_710 = auVar84._16_4_ + fStack_7d0;
        fStack_70c = auVar84._20_4_ + fStack_7cc;
        fStack_708 = auVar84._24_4_ + fStack_7c8;
        fStack_704 = auVar84._28_4_ + fStack_7c4;
        _local_6c0 = _local_740;
        for (bVar53 = (byte)uVar12 & bVar52; auVar83 = _local_6c0, bVar53 != 0;
            bVar53 = ~bVar56 & bVar53 & (byte)uVar12) {
          auVar154._8_4_ = 0x7f800000;
          auVar154._0_8_ = 0x7f8000007f800000;
          auVar154._12_4_ = 0x7f800000;
          auVar154._16_4_ = 0x7f800000;
          auVar154._20_4_ = 0x7f800000;
          auVar154._24_4_ = 0x7f800000;
          auVar154._28_4_ = 0x7f800000;
          auVar83 = vblendmps_avx512vl(auVar154,auVar84);
          auVar122._0_4_ =
               (uint)(bVar53 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar53 & 1) * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 1 & 1);
          auVar122._4_4_ = (uint)bVar57 * auVar83._4_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 2 & 1);
          auVar122._8_4_ = (uint)bVar57 * auVar83._8_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 3 & 1);
          auVar122._12_4_ = (uint)bVar57 * auVar83._12_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 4 & 1);
          auVar122._16_4_ = (uint)bVar57 * auVar83._16_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 5 & 1);
          auVar122._20_4_ = (uint)bVar57 * auVar83._20_4_ | (uint)!bVar57 * 0x7f800000;
          auVar122._24_4_ =
               (uint)(bVar53 >> 6) * auVar83._24_4_ | (uint)!(bool)(bVar53 >> 6) * 0x7f800000;
          auVar122._28_4_ = 0x7f800000;
          auVar83 = vshufps_avx(auVar122,auVar122,0xb1);
          auVar83 = vminps_avx(auVar122,auVar83);
          auVar85 = vshufpd_avx(auVar83,auVar83,5);
          auVar83 = vminps_avx(auVar83,auVar85);
          auVar85 = vpermpd_avx2(auVar83,0x4e);
          auVar83 = vminps_avx(auVar83,auVar85);
          uVar12 = vcmpps_avx512vl(auVar122,auVar83,0);
          bVar48 = (byte)uVar12 & bVar53;
          bVar56 = bVar53;
          if (bVar48 != 0) {
            bVar56 = bVar48;
          }
          iVar15 = 0;
          for (uVar59 = (uint)bVar56; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x80000000) {
            iVar15 = iVar15 + 1;
          }
          bVar56 = '\x01' << ((byte)iVar15 & 0x1f);
          uVar59 = *(uint *)(local_520 + (uint)(iVar15 << 2));
          uVar133 = *(uint *)(local_440 + (uint)(iVar15 << 2));
          fVar225 = auVar65._0_4_;
          if ((float)local_9e0._0_4_ < 0.0) {
            auVar256 = ZEXT1664(auVar256._0_16_);
            auVar261 = ZEXT1664(auVar261._0_16_);
            auVar262 = ZEXT1664(auVar262._0_16_);
            fVar225 = sqrtf((float)local_9e0._0_4_);
          }
          auVar251 = ZEXT464(uVar133);
          uVar58 = (ulong)bVar56;
          auVar67 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
          auVar60 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
          auVar11 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar61 = vminps_avx(auVar67,auVar11);
          auVar67 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar11 = vmaxps_avx(auVar60,auVar67);
          auVar204._8_4_ = 0x7fffffff;
          auVar204._0_8_ = 0x7fffffff7fffffff;
          auVar204._12_4_ = 0x7fffffff;
          auVar60 = vandps_avx(auVar61,auVar204);
          auVar67 = vandps_avx(auVar11,auVar204);
          auVar60 = vmaxps_avx(auVar60,auVar67);
          auVar67 = vmovshdup_avx(auVar60);
          auVar67 = vmaxss_avx(auVar67,auVar60);
          auVar60 = vshufpd_avx(auVar60,auVar60,1);
          auVar60 = vmaxss_avx(auVar60,auVar67);
          fVar200 = auVar60._0_4_ * 1.9073486e-06;
          local_920 = vshufps_avx(auVar11,auVar11,0xff);
          auVar60 = vinsertps_avx(ZEXT416(uVar133),ZEXT416(uVar59),0x10);
          auVar159 = ZEXT1664(auVar60);
          uVar54 = 0;
          while( true ) {
            bVar48 = (byte)uVar58;
            if (uVar54 == 5) break;
            uVar161 = auVar159._0_4_;
            auVar143._4_4_ = uVar161;
            auVar143._0_4_ = uVar161;
            auVar143._8_4_ = uVar161;
            auVar143._12_4_ = uVar161;
            auVar60 = vfmadd132ps_fma(auVar143,ZEXT816(0) << 0x40,local_9d0);
            auVar67 = vmovshdup_avx(auVar159._0_16_);
            fVar243 = auVar67._0_4_;
            fVar224 = 1.0 - fVar243;
            fVar219 = fVar243 * fVar243;
            auVar62 = SUB6416(ZEXT464(0x40400000),0);
            auVar68 = SUB6416(ZEXT464(0xc0a00000),0);
            auVar61 = vfmadd213ss_fma(auVar62,auVar67,auVar68);
            auVar11 = vfmadd213ss_fma(auVar61,ZEXT416((uint)fVar219),SUB6416(ZEXT464(0x40000000),0))
            ;
            auVar72 = vfmadd213ss_fma(auVar62,ZEXT416((uint)fVar224),auVar68);
            auVar72 = vfmadd213ss_fma(auVar72,ZEXT416((uint)(fVar224 * fVar224)),
                                      SUB6416(ZEXT464(0x40000000),0));
            fVar220 = fVar224 * fVar224 * -fVar243 * 0.5;
            fVar221 = auVar11._0_4_ * 0.5;
            fVar222 = auVar72._0_4_ * 0.5;
            fVar223 = fVar243 * fVar243 * -fVar224 * 0.5;
            auVar205._0_4_ = fVar223 * (float)local_9c0._0_4_;
            auVar205._4_4_ = fVar223 * (float)local_9c0._4_4_;
            auVar205._8_4_ = fVar223 * fStack_9b8;
            auVar205._12_4_ = fVar223 * fStack_9b4;
            auVar228._4_4_ = fVar222;
            auVar228._0_4_ = fVar222;
            auVar228._8_4_ = fVar222;
            auVar228._12_4_ = fVar222;
            auVar11 = vfmadd132ps_fma(auVar228,auVar205,local_980._0_16_);
            auVar181._4_4_ = fVar221;
            auVar181._0_4_ = fVar221;
            auVar181._8_4_ = fVar221;
            auVar181._12_4_ = fVar221;
            auVar11 = vfmadd132ps_fma(auVar181,auVar11,local_9a0._0_16_);
            auVar206._4_4_ = fVar220;
            auVar206._0_4_ = fVar220;
            auVar206._8_4_ = fVar220;
            auVar206._12_4_ = fVar220;
            auVar11 = vfmadd132ps_fma(auVar206,auVar11,local_960._0_16_);
            auVar72 = vfmadd231ss_fma(auVar68,auVar67,ZEXT416(0x41100000));
            local_880._0_16_ = auVar72;
            auVar72 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar67,ZEXT416(0x40800000));
            local_8a0._0_16_ = auVar72;
            auVar72 = vfmadd213ss_fma(auVar62,auVar67,ZEXT416(0xbf800000));
            local_8c0._0_16_ = auVar72;
            _local_860 = auVar11;
            auVar11 = vsubps_avx(auVar60,auVar11);
            auVar60 = vdpps_avx(auVar11,auVar11,0x7f);
            fVar220 = auVar60._0_4_;
            local_7c0 = auVar159;
            if (fVar220 < 0.0) {
              local_a00._0_4_ = fVar219;
              local_a20._0_4_ = fVar224 * -2.0;
              auVar262._0_4_ = sqrtf(fVar220);
              auVar262._4_60_ = extraout_var;
              auVar61 = ZEXT416(auVar61._0_4_);
              auVar72 = auVar262._0_16_;
              uVar58 = extraout_RAX;
            }
            else {
              auVar72 = vsqrtss_avx(auVar60,auVar60);
              local_a20._0_4_ = fVar224 * -2.0;
              local_a00._0_4_ = fVar219;
            }
            auVar69 = vfnmadd231ss_fma(ZEXT416((uint)(fVar243 * (fVar224 + fVar224))),
                                       ZEXT416((uint)fVar224),ZEXT416((uint)fVar224));
            auVar61 = vfmadd213ss_fma(auVar61,ZEXT416((uint)(fVar243 + fVar243)),
                                      ZEXT416((uint)(fVar243 * fVar243 * 3.0)));
            auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar67,
                                      SUB6416(ZEXT464(0x40000000),0));
            auVar62 = vfmadd231ss_fma(ZEXT416((uint)(fVar224 * fVar224 * -3.0)),
                                      ZEXT416((uint)(fVar224 + fVar224)),auVar68);
            auVar68 = vfmadd213ss_fma(ZEXT416((uint)local_a20._0_4_),auVar67,
                                      ZEXT416((uint)local_a00._0_4_));
            fVar219 = auVar69._0_4_ * 0.5;
            fVar221 = auVar61._0_4_ * 0.5;
            fVar222 = auVar62._0_4_ * 0.5;
            fVar223 = auVar68._0_4_ * 0.5;
            auVar207._0_4_ = fVar223 * (float)local_9c0._0_4_;
            auVar207._4_4_ = fVar223 * (float)local_9c0._4_4_;
            auVar207._8_4_ = fVar223 * fStack_9b8;
            auVar207._12_4_ = fVar223 * fStack_9b4;
            auVar182._4_4_ = fVar222;
            auVar182._0_4_ = fVar222;
            auVar182._8_4_ = fVar222;
            auVar182._12_4_ = fVar222;
            auVar61 = vfmadd132ps_fma(auVar182,auVar207,local_980._0_16_);
            auVar164._4_4_ = fVar221;
            auVar164._0_4_ = fVar221;
            auVar164._8_4_ = fVar221;
            auVar164._12_4_ = fVar221;
            auVar61 = vfmadd132ps_fma(auVar164,auVar61,local_9a0._0_16_);
            auVar264._4_4_ = fVar219;
            auVar264._0_4_ = fVar219;
            auVar264._8_4_ = fVar219;
            auVar264._12_4_ = fVar219;
            auVar61 = vfmadd132ps_fma(auVar264,auVar61,local_960._0_16_);
            local_a00._0_16_ = vdpps_avx(auVar61,auVar61,0x7f);
            auVar41._12_4_ = 0;
            auVar41._0_12_ = ZEXT812(0);
            fVar219 = local_a00._0_4_;
            auVar68 = vrsqrt14ss_avx512f(auVar41 << 0x20,ZEXT416((uint)fVar219));
            fVar221 = auVar68._0_4_;
            local_a20._0_16_ = vrcp14ss_avx512f(auVar41 << 0x20,ZEXT416((uint)fVar219));
            auVar17._8_4_ = 0x80000000;
            auVar17._0_8_ = 0x8000000080000000;
            auVar17._12_4_ = 0x80000000;
            auVar62 = vxorps_avx512vl(local_a00._0_16_,auVar17);
            auVar68 = vfnmadd213ss_fma(local_a20._0_16_,local_a00._0_16_,
                                       SUB6416(ZEXT464(0x40000000),0));
            local_8e0._0_4_ = auVar68._0_4_;
            uVar59 = auVar72._0_4_;
            if (fVar219 < auVar62._0_4_) {
              fVar222 = sqrtf(fVar219);
              auVar72 = ZEXT416(uVar59);
              uVar58 = extraout_RAX_00;
            }
            else {
              auVar68 = vsqrtss_avx(local_a00._0_16_,local_a00._0_16_);
              fVar222 = auVar68._0_4_;
            }
            fVar219 = fVar221 * 1.5 + fVar219 * -0.5 * fVar221 * fVar221 * fVar221;
            auVar144._0_4_ = auVar61._0_4_ * fVar219;
            auVar144._4_4_ = auVar61._4_4_ * fVar219;
            auVar144._8_4_ = auVar61._8_4_ * fVar219;
            auVar144._12_4_ = auVar61._12_4_ * fVar219;
            auVar68 = vdpps_avx(auVar11,auVar144,0x7f);
            fVar224 = auVar72._0_4_;
            fVar221 = auVar68._0_4_;
            auVar145._0_4_ = fVar221 * fVar221;
            auVar145._4_4_ = auVar68._4_4_ * auVar68._4_4_;
            auVar145._8_4_ = auVar68._8_4_ * auVar68._8_4_;
            auVar145._12_4_ = auVar68._12_4_ * auVar68._12_4_;
            auVar62 = vsubps_avx512vl(auVar60,auVar145);
            fVar223 = auVar62._0_4_;
            auVar165._4_12_ = ZEXT812(0) << 0x20;
            auVar165._0_4_ = fVar223;
            auVar69 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar165);
            auVar70 = vmulss_avx512f(auVar62,ZEXT416(0xbf000000));
            if (fVar223 < 0.0) {
              local_910 = fVar219;
              fStack_90c = fVar219;
              fStack_908 = fVar219;
              fStack_904 = fVar219;
              local_900 = auVar69;
              fVar223 = sqrtf(fVar223);
              auVar70 = ZEXT416(auVar70._0_4_);
              auVar72 = ZEXT416(uVar59);
              uVar58 = extraout_RAX_01;
              auVar62 = local_900;
              fVar219 = local_910;
              fVar243 = fStack_90c;
              fVar244 = fStack_908;
              fVar245 = fStack_904;
            }
            else {
              auVar62 = vsqrtss_avx(auVar62,auVar62);
              fVar223 = auVar62._0_4_;
              auVar62 = auVar69;
              fVar243 = fVar219;
              fVar244 = fVar219;
              fVar245 = fVar219;
            }
            auVar261 = ZEXT1664(auVar11);
            auVar166._0_4_ = (float)local_8c0._0_4_ * (float)local_9c0._0_4_;
            auVar166._4_4_ = (float)local_8c0._0_4_ * (float)local_9c0._4_4_;
            auVar166._8_4_ = (float)local_8c0._0_4_ * fStack_9b8;
            auVar166._12_4_ = (float)local_8c0._0_4_ * fStack_9b4;
            auVar183._4_4_ = local_8a0._0_4_;
            auVar183._0_4_ = local_8a0._0_4_;
            auVar183._8_4_ = local_8a0._0_4_;
            auVar183._12_4_ = local_8a0._0_4_;
            auVar64 = vfmadd132ps_fma(auVar183,auVar166,local_980._0_16_);
            auVar167._4_4_ = local_880._0_4_;
            auVar167._0_4_ = local_880._0_4_;
            auVar167._8_4_ = local_880._0_4_;
            auVar167._12_4_ = local_880._0_4_;
            auVar64 = vfmadd132ps_fma(auVar167,auVar64,local_9a0._0_16_);
            auVar67 = vfmadd213ss_fma(auVar67,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
            uVar161 = auVar67._0_4_;
            auVar184._4_4_ = uVar161;
            auVar184._0_4_ = uVar161;
            auVar184._8_4_ = uVar161;
            auVar184._12_4_ = uVar161;
            auVar67 = vfmadd132ps_fma(auVar184,auVar64,local_960._0_16_);
            auVar168._0_4_ = auVar67._0_4_ * (float)local_a00._0_4_;
            auVar168._4_4_ = auVar67._4_4_ * (float)local_a00._0_4_;
            auVar168._8_4_ = auVar67._8_4_ * (float)local_a00._0_4_;
            auVar168._12_4_ = auVar67._12_4_ * (float)local_a00._0_4_;
            auVar67 = vdpps_avx(auVar61,auVar67,0x7f);
            fVar179 = auVar67._0_4_;
            auVar185._0_4_ = auVar61._0_4_ * fVar179;
            auVar185._4_4_ = auVar61._4_4_ * fVar179;
            auVar185._8_4_ = auVar61._8_4_ * fVar179;
            auVar185._12_4_ = auVar61._12_4_ * fVar179;
            auVar67 = vsubps_avx(auVar168,auVar185);
            fVar179 = (float)local_8e0._0_4_ * (float)local_a20._0_4_;
            auVar64 = vmaxss_avx(ZEXT416((uint)fVar200),
                                 ZEXT416((uint)(local_7c0._0_4_ * fVar225 * 1.9073486e-06)));
            auVar18._8_4_ = 0x80000000;
            auVar18._0_8_ = 0x8000000080000000;
            auVar18._12_4_ = 0x80000000;
            auVar127._16_48_ = local_7c0._16_48_;
            auVar71 = vxorps_avx512vl(auVar61,auVar18);
            auVar186._0_4_ = fVar219 * auVar67._0_4_ * fVar179;
            auVar186._4_4_ = fVar243 * auVar67._4_4_ * fVar179;
            auVar186._8_4_ = fVar244 * auVar67._8_4_ * fVar179;
            auVar186._12_4_ = fVar245 * auVar67._12_4_ * fVar179;
            auVar262 = ZEXT1664(auVar144);
            auVar67 = vdpps_avx(auVar71,auVar144,0x7f);
            auVar63 = vfmadd213ss_fma(auVar72,ZEXT416((uint)fVar200),auVar64);
            auVar72 = vdpps_avx(auVar11,auVar186,0x7f);
            auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar224 + 1.0)),
                                      ZEXT416((uint)(fVar200 / fVar222)),auVar63);
            fVar219 = auVar67._0_4_ + auVar72._0_4_;
            auVar67 = vdpps_avx(local_9d0,auVar144,0x7f);
            auVar72 = vdpps_avx(auVar11,auVar71,0x7f);
            auVar70 = vmulss_avx512f(auVar70,auVar62);
            fVar222 = auVar69._0_4_ * 1.5 + auVar70._0_4_ * auVar62._0_4_ * auVar62._0_4_;
            auVar62 = vdpps_avx(auVar11,local_9d0,0x7f);
            auVar70 = vfnmadd231ss_fma(auVar72,auVar68,ZEXT416((uint)fVar219));
            auVar62 = vfnmadd231ss_fma(auVar62,auVar68,auVar67);
            auVar72 = vpermilps_avx(_local_860,0xff);
            fVar223 = fVar223 - auVar72._0_4_;
            auVar69 = vshufps_avx(auVar61,auVar61,0xff);
            auVar72 = vfmsub213ss_fma(auVar70,ZEXT416((uint)fVar222),auVar69);
            auVar253._8_4_ = 0x80000000;
            auVar253._0_8_ = 0x8000000080000000;
            auVar253._12_4_ = 0x80000000;
            auVar256 = ZEXT1664(auVar253);
            auVar248._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
            auVar248._8_4_ = auVar72._8_4_ ^ 0x80000000;
            auVar248._12_4_ = auVar72._12_4_ ^ 0x80000000;
            auVar251 = ZEXT1664(auVar248);
            auVar62 = ZEXT416((uint)(auVar62._0_4_ * fVar222));
            auVar70 = vfmsub231ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar72._0_4_)),
                                      ZEXT416((uint)fVar219),auVar62);
            auVar72 = vinsertps_avx(auVar248,auVar62,0x1c);
            auVar233._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
            auVar233._8_4_ = auVar67._8_4_ ^ 0x80000000;
            auVar233._12_4_ = auVar67._12_4_ ^ 0x80000000;
            auVar62 = vinsertps_avx(ZEXT416((uint)fVar219),auVar233,0x10);
            auVar208._0_4_ = auVar70._0_4_;
            auVar208._4_4_ = auVar208._0_4_;
            auVar208._8_4_ = auVar208._0_4_;
            auVar208._12_4_ = auVar208._0_4_;
            auVar67 = vdivps_avx(auVar72,auVar208);
            auVar72 = vdivps_avx(auVar62,auVar208);
            auVar209._0_4_ = fVar221 * auVar67._0_4_ + fVar223 * auVar72._0_4_;
            auVar209._4_4_ = fVar221 * auVar67._4_4_ + fVar223 * auVar72._4_4_;
            auVar209._8_4_ = fVar221 * auVar67._8_4_ + fVar223 * auVar72._8_4_;
            auVar209._12_4_ = fVar221 * auVar67._12_4_ + fVar223 * auVar72._12_4_;
            auVar67 = vsubps_avx(local_7c0._0_16_,auVar209);
            auVar159 = ZEXT1664(auVar67);
            auVar19._8_4_ = 0x7fffffff;
            auVar19._0_8_ = 0x7fffffff7fffffff;
            auVar19._12_4_ = 0x7fffffff;
            auVar72 = vandps_avx512vl(auVar68,auVar19);
            if (auVar72._0_4_ < auVar63._0_4_) {
              auVar72 = vfmadd231ss_fma(ZEXT416((uint)(auVar63._0_4_ + auVar64._0_4_)),local_920,
                                        ZEXT416(0x36000000));
              auVar20._8_4_ = 0x7fffffff;
              auVar20._0_8_ = 0x7fffffff7fffffff;
              auVar20._12_4_ = 0x7fffffff;
              auVar68 = vandps_avx512vl(ZEXT416((uint)fVar223),auVar20);
              if (auVar68._0_4_ < auVar72._0_4_) {
                bVar57 = uVar54 < 5;
                fVar225 = auVar67._0_4_ + (float)local_930._0_4_;
                if ((fVar160 <= fVar225) &&
                   (fVar200 = *(float *)(ray + k * 4 + 0x200), fVar225 <= fVar200)) {
                  auVar67 = vmovshdup_avx(auVar67);
                  bVar48 = 0;
                  if ((auVar67._0_4_ < 0.0) || (1.0 < auVar67._0_4_)) goto LAB_017fc84d;
                  auVar210._0_12_ = ZEXT812(0);
                  auVar210._12_4_ = 0;
                  auVar127._0_16_ = auVar210;
                  auVar126._4_60_ = auVar127._4_60_;
                  auVar126._0_4_ = fVar220;
                  auVar67 = vrsqrt14ss_avx512f(auVar210,auVar126._0_16_);
                  fVar219 = auVar67._0_4_;
                  auVar60 = vmulss_avx512f(auVar60,ZEXT416(0xbf000000));
                  pGVar2 = (context->scene->geometries).items[uVar1].ptr;
                  if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar48 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_017fc84d;
                    fVar219 = fVar219 * 1.5 + auVar60._0_4_ * fVar219 * fVar219 * fVar219;
                    auVar187._0_4_ = auVar11._0_4_ * fVar219;
                    auVar187._4_4_ = auVar11._4_4_ * fVar219;
                    auVar187._8_4_ = auVar11._8_4_ * fVar219;
                    auVar187._12_4_ = auVar11._12_4_ * fVar219;
                    auVar72 = vfmadd213ps_fma(auVar69,auVar187,auVar61);
                    auVar60 = vshufps_avx(auVar187,auVar187,0xc9);
                    auVar67 = vshufps_avx(auVar61,auVar61,0xc9);
                    auVar188._0_4_ = auVar187._0_4_ * auVar67._0_4_;
                    auVar188._4_4_ = auVar187._4_4_ * auVar67._4_4_;
                    auVar188._8_4_ = auVar187._8_4_ * auVar67._8_4_;
                    auVar188._12_4_ = auVar187._12_4_ * auVar67._12_4_;
                    auVar61 = vfmsub231ps_fma(auVar188,auVar61,auVar60);
                    auVar60 = vshufps_avx(auVar61,auVar61,0xc9);
                    auVar67 = vshufps_avx(auVar72,auVar72,0xc9);
                    auVar61 = vshufps_avx(auVar61,auVar61,0xd2);
                    auVar146._0_4_ = auVar72._0_4_ * auVar61._0_4_;
                    auVar146._4_4_ = auVar72._4_4_ * auVar61._4_4_;
                    auVar146._8_4_ = auVar72._8_4_ * auVar61._8_4_;
                    auVar146._12_4_ = auVar72._12_4_ * auVar61._12_4_;
                    auVar60 = vfmsub231ps_fma(auVar146,auVar60,auVar67);
                    auVar128 = vbroadcastss_avx512f(ZEXT416(1));
                    local_340 = vpermps_avx512f(auVar128,auVar159);
                    auVar159 = vpermps_avx512f(auVar128,ZEXT1664(auVar60));
                    auVar128 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar128,ZEXT1664(auVar60));
                    local_380 = vbroadcastss_avx512f(auVar60);
                    local_400[0] = (RTCHitN)auVar159[0];
                    local_400[1] = (RTCHitN)auVar159[1];
                    local_400[2] = (RTCHitN)auVar159[2];
                    local_400[3] = (RTCHitN)auVar159[3];
                    local_400[4] = (RTCHitN)auVar159[4];
                    local_400[5] = (RTCHitN)auVar159[5];
                    local_400[6] = (RTCHitN)auVar159[6];
                    local_400[7] = (RTCHitN)auVar159[7];
                    local_400[8] = (RTCHitN)auVar159[8];
                    local_400[9] = (RTCHitN)auVar159[9];
                    local_400[10] = (RTCHitN)auVar159[10];
                    local_400[0xb] = (RTCHitN)auVar159[0xb];
                    local_400[0xc] = (RTCHitN)auVar159[0xc];
                    local_400[0xd] = (RTCHitN)auVar159[0xd];
                    local_400[0xe] = (RTCHitN)auVar159[0xe];
                    local_400[0xf] = (RTCHitN)auVar159[0xf];
                    local_400[0x10] = (RTCHitN)auVar159[0x10];
                    local_400[0x11] = (RTCHitN)auVar159[0x11];
                    local_400[0x12] = (RTCHitN)auVar159[0x12];
                    local_400[0x13] = (RTCHitN)auVar159[0x13];
                    local_400[0x14] = (RTCHitN)auVar159[0x14];
                    local_400[0x15] = (RTCHitN)auVar159[0x15];
                    local_400[0x16] = (RTCHitN)auVar159[0x16];
                    local_400[0x17] = (RTCHitN)auVar159[0x17];
                    local_400[0x18] = (RTCHitN)auVar159[0x18];
                    local_400[0x19] = (RTCHitN)auVar159[0x19];
                    local_400[0x1a] = (RTCHitN)auVar159[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar159[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar159[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar159[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar159[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar159[0x1f];
                    local_400[0x20] = (RTCHitN)auVar159[0x20];
                    local_400[0x21] = (RTCHitN)auVar159[0x21];
                    local_400[0x22] = (RTCHitN)auVar159[0x22];
                    local_400[0x23] = (RTCHitN)auVar159[0x23];
                    local_400[0x24] = (RTCHitN)auVar159[0x24];
                    local_400[0x25] = (RTCHitN)auVar159[0x25];
                    local_400[0x26] = (RTCHitN)auVar159[0x26];
                    local_400[0x27] = (RTCHitN)auVar159[0x27];
                    local_400[0x28] = (RTCHitN)auVar159[0x28];
                    local_400[0x29] = (RTCHitN)auVar159[0x29];
                    local_400[0x2a] = (RTCHitN)auVar159[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar159[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar159[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar159[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar159[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar159[0x2f];
                    local_400[0x30] = (RTCHitN)auVar159[0x30];
                    local_400[0x31] = (RTCHitN)auVar159[0x31];
                    local_400[0x32] = (RTCHitN)auVar159[0x32];
                    local_400[0x33] = (RTCHitN)auVar159[0x33];
                    local_400[0x34] = (RTCHitN)auVar159[0x34];
                    local_400[0x35] = (RTCHitN)auVar159[0x35];
                    local_400[0x36] = (RTCHitN)auVar159[0x36];
                    local_400[0x37] = (RTCHitN)auVar159[0x37];
                    local_400[0x38] = (RTCHitN)auVar159[0x38];
                    local_400[0x39] = (RTCHitN)auVar159[0x39];
                    local_400[0x3a] = (RTCHitN)auVar159[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar159[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar159[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar159[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar159[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar159[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_480._0_8_;
                    uStack_2b8 = local_480._8_8_;
                    uStack_2b0 = local_480._16_8_;
                    uStack_2a8 = local_480._24_8_;
                    uStack_2a0 = local_480._32_8_;
                    uStack_298 = local_480._40_8_;
                    uStack_290 = local_480._48_8_;
                    uStack_288 = local_480._56_8_;
                    auVar159 = vmovdqa64_avx512f(local_4c0);
                    local_280 = vmovdqa64_avx512f(auVar159);
                    vpcmpeqd_avx2(auVar159._0_32_,auVar159._0_32_);
                    local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar225;
                    auVar159 = vmovdqa64_avx512f(local_500);
                    local_780 = vmovdqa64_avx512f(auVar159);
                    local_a50.valid = (int *)local_780;
                    local_a50.geometryUserPtr = pGVar2->userPtr;
                    local_a50.context = context->user;
                    local_a50.hit = local_400;
                    local_a50.N = 0x10;
                    local_a50.ray = (RTCRayN *)ray;
                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar251 = ZEXT1664(auVar248);
                      auVar256 = ZEXT1664(auVar253);
                      auVar261 = ZEXT1664(auVar11);
                      auVar262 = ZEXT1664(auVar144);
                      (*pGVar2->occlusionFilterN)(&local_a50);
                      auVar159 = vmovdqa64_avx512f(local_780);
                    }
                    uVar12 = vptestmd_avx512f(auVar159,auVar159);
                    if ((short)uVar12 != 0) {
                      p_Var3 = context->args->filter;
                      if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar251 = ZEXT1664(auVar251._0_16_);
                        auVar256 = ZEXT1664(auVar256._0_16_);
                        auVar261 = ZEXT1664(auVar261._0_16_);
                        auVar262 = ZEXT1664(auVar262._0_16_);
                        (*p_Var3)(&local_a50);
                        auVar159 = vmovdqa64_avx512f(local_780);
                      }
                      uVar58 = vptestmd_avx512f(auVar159,auVar159);
                      auVar159 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                      bVar4 = (bool)((byte)uVar58 & 1);
                      auVar129._0_4_ =
                           (uint)bVar4 * auVar159._0_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x200);
                      bVar4 = (bool)((byte)(uVar58 >> 1) & 1);
                      auVar129._4_4_ =
                           (uint)bVar4 * auVar159._4_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x204);
                      bVar4 = (bool)((byte)(uVar58 >> 2) & 1);
                      auVar129._8_4_ =
                           (uint)bVar4 * auVar159._8_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x208);
                      bVar4 = (bool)((byte)(uVar58 >> 3) & 1);
                      auVar129._12_4_ =
                           (uint)bVar4 * auVar159._12_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x20c);
                      bVar4 = (bool)((byte)(uVar58 >> 4) & 1);
                      auVar129._16_4_ =
                           (uint)bVar4 * auVar159._16_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x210);
                      bVar4 = (bool)((byte)(uVar58 >> 5) & 1);
                      auVar129._20_4_ =
                           (uint)bVar4 * auVar159._20_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x214);
                      bVar4 = (bool)((byte)(uVar58 >> 6) & 1);
                      auVar129._24_4_ =
                           (uint)bVar4 * auVar159._24_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x218);
                      bVar4 = (bool)((byte)(uVar58 >> 7) & 1);
                      auVar129._28_4_ =
                           (uint)bVar4 * auVar159._28_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x21c);
                      bVar4 = (bool)((byte)(uVar58 >> 8) & 1);
                      auVar129._32_4_ =
                           (uint)bVar4 * auVar159._32_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x220);
                      bVar4 = (bool)((byte)(uVar58 >> 9) & 1);
                      auVar129._36_4_ =
                           (uint)bVar4 * auVar159._36_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x224);
                      bVar4 = (bool)((byte)(uVar58 >> 10) & 1);
                      auVar129._40_4_ =
                           (uint)bVar4 * auVar159._40_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x228);
                      bVar4 = (bool)((byte)(uVar58 >> 0xb) & 1);
                      auVar129._44_4_ =
                           (uint)bVar4 * auVar159._44_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x22c);
                      bVar4 = (bool)((byte)(uVar58 >> 0xc) & 1);
                      auVar129._48_4_ =
                           (uint)bVar4 * auVar159._48_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x230);
                      bVar4 = (bool)((byte)(uVar58 >> 0xd) & 1);
                      auVar129._52_4_ =
                           (uint)bVar4 * auVar159._52_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x234);
                      bVar4 = (bool)((byte)(uVar58 >> 0xe) & 1);
                      auVar129._56_4_ =
                           (uint)bVar4 * auVar159._56_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x238);
                      bVar4 = SUB81(uVar58 >> 0xf,0);
                      auVar129._60_4_ =
                           (uint)bVar4 * auVar159._60_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x23c);
                      *(undefined1 (*) [64])(local_a50.ray + 0x200) = auVar129;
                      bVar48 = 1;
                      if ((short)uVar58 != 0) goto LAB_017fc84d;
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar200;
                    bVar48 = 0;
                    goto LAB_017fc84d;
                  }
                }
                bVar48 = 0;
                goto LAB_017fc84d;
              }
            }
            uVar54 = uVar54 + 1;
          }
          bVar57 = false;
LAB_017fc84d:
          bVar49 = bVar49 | bVar57 & bVar48;
          uVar161 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar235._4_4_ = uVar161;
          auVar235._0_4_ = uVar161;
          auVar235._8_4_ = uVar161;
          auVar235._12_4_ = uVar161;
          auVar235._16_4_ = uVar161;
          auVar235._20_4_ = uVar161;
          auVar235._24_4_ = uVar161;
          auVar235._28_4_ = uVar161;
          auVar159 = ZEXT3264(auVar235);
          auVar43._4_4_ = fStack_71c;
          auVar43._0_4_ = local_720;
          auVar43._8_4_ = fStack_718;
          auVar43._12_4_ = fStack_714;
          auVar43._16_4_ = fStack_710;
          auVar43._20_4_ = fStack_70c;
          auVar43._24_4_ = fStack_708;
          auVar43._28_4_ = fStack_704;
          uVar12 = vcmpps_avx512vl(auVar235,auVar43,0xd);
        }
        auVar155._0_4_ = (float)local_7e0._0_4_ + (float)local_740._0_4_;
        auVar155._4_4_ = (float)local_7e0._4_4_ + (float)local_740._4_4_;
        auVar155._8_4_ = fStack_7d8 + fStack_738;
        auVar155._12_4_ = fStack_7d4 + fStack_734;
        auVar155._16_4_ = fStack_7d0 + fStack_730;
        auVar155._20_4_ = fStack_7cc + fStack_72c;
        auVar155._24_4_ = fStack_7c8 + fStack_728;
        auVar155._28_4_ = fStack_7c4 + fStack_724;
        uVar161 = auVar159._0_4_;
        auVar175._4_4_ = uVar161;
        auVar175._0_4_ = uVar161;
        auVar175._8_4_ = uVar161;
        auVar175._12_4_ = uVar161;
        auVar175._16_4_ = uVar161;
        auVar175._20_4_ = uVar161;
        auVar175._24_4_ = uVar161;
        auVar175._28_4_ = uVar161;
        uVar12 = vcmpps_avx512vl(auVar155,auVar175,2);
        auVar156._8_4_ = 2;
        auVar156._0_8_ = 0x200000002;
        auVar156._12_4_ = 2;
        auVar156._16_4_ = 2;
        auVar156._20_4_ = 2;
        auVar156._24_4_ = 2;
        auVar156._28_4_ = 2;
        auVar28._8_4_ = 3;
        auVar28._0_8_ = 0x300000003;
        auVar28._12_4_ = 3;
        auVar28._16_4_ = 3;
        auVar28._20_4_ = 3;
        auVar28._24_4_ = 3;
        auVar28._28_4_ = 3;
        auVar84 = vpblendmd_avx512vl(auVar156,auVar28);
        local_740._0_4_ = (uint)(bVar47 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar47 & 1) * 2;
        bVar57 = (bool)(bVar47 >> 1 & 1);
        local_740._4_4_ = (uint)bVar57 * auVar84._4_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)(bVar47 >> 2 & 1);
        fStack_738 = (float)((uint)bVar57 * auVar84._8_4_ | (uint)!bVar57 * 2);
        bVar57 = (bool)(bVar47 >> 3 & 1);
        fStack_734 = (float)((uint)bVar57 * auVar84._12_4_ | (uint)!bVar57 * 2);
        bVar57 = (bool)(bVar47 >> 4 & 1);
        fStack_730 = (float)((uint)bVar57 * auVar84._16_4_ | (uint)!bVar57 * 2);
        bVar57 = (bool)(bVar47 >> 5 & 1);
        fStack_72c = (float)((uint)bVar57 * auVar84._20_4_ | (uint)!bVar57 * 2);
        bVar57 = (bool)(bVar47 >> 6 & 1);
        fStack_728 = (float)((uint)bVar57 * auVar84._24_4_ | (uint)!bVar57 * 2);
        fStack_724 = (float)((uint)(bVar47 >> 7) * auVar84._28_4_ | (uint)!(bool)(bVar47 >> 7) * 2);
        bVar46 = (byte)uVar13 & bVar46 & (byte)uVar12;
        uVar12 = vpcmpd_avx512vl(_local_740,local_6e0,2);
        local_720 = (float)local_7e0._0_4_ + (float)local_6c0._0_4_;
        fStack_71c = (float)local_7e0._4_4_ + (float)local_6c0._4_4_;
        fStack_718 = fStack_7d8 + fStack_6b8;
        fStack_714 = fStack_7d4 + fStack_6b4;
        fStack_710 = fStack_7d0 + fStack_6b0;
        fStack_70c = fStack_7cc + fStack_6ac;
        fStack_708 = fStack_7c8 + fStack_6a8;
        fStack_704 = fStack_7c4 + fStack_6a4;
        for (bVar53 = (byte)uVar12 & bVar46; bVar53 != 0; bVar53 = ~bVar47 & bVar53 & (byte)uVar12)
        {
          auVar157._8_4_ = 0x7f800000;
          auVar157._0_8_ = 0x7f8000007f800000;
          auVar157._12_4_ = 0x7f800000;
          auVar157._16_4_ = 0x7f800000;
          auVar157._20_4_ = 0x7f800000;
          auVar157._24_4_ = 0x7f800000;
          auVar157._28_4_ = 0x7f800000;
          auVar84 = vblendmps_avx512vl(auVar157,auVar83);
          auVar123._0_4_ =
               (uint)(bVar53 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar53 & 1) * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 1 & 1);
          auVar123._4_4_ = (uint)bVar57 * auVar84._4_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 2 & 1);
          auVar123._8_4_ = (uint)bVar57 * auVar84._8_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 3 & 1);
          auVar123._12_4_ = (uint)bVar57 * auVar84._12_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 4 & 1);
          auVar123._16_4_ = (uint)bVar57 * auVar84._16_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 5 & 1);
          auVar123._20_4_ = (uint)bVar57 * auVar84._20_4_ | (uint)!bVar57 * 0x7f800000;
          auVar123._24_4_ =
               (uint)(bVar53 >> 6) * auVar84._24_4_ | (uint)!(bool)(bVar53 >> 6) * 0x7f800000;
          auVar123._28_4_ = 0x7f800000;
          auVar84 = vshufps_avx(auVar123,auVar123,0xb1);
          auVar84 = vminps_avx(auVar123,auVar84);
          auVar85 = vshufpd_avx(auVar84,auVar84,5);
          auVar84 = vminps_avx(auVar84,auVar85);
          auVar85 = vpermpd_avx2(auVar84,0x4e);
          auVar84 = vminps_avx(auVar84,auVar85);
          uVar12 = vcmpps_avx512vl(auVar123,auVar84,0);
          bVar56 = (byte)uVar12 & bVar53;
          bVar47 = bVar53;
          if (bVar56 != 0) {
            bVar47 = bVar56;
          }
          iVar15 = 0;
          for (uVar59 = (uint)bVar47; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x80000000) {
            iVar15 = iVar15 + 1;
          }
          bVar47 = '\x01' << ((byte)iVar15 & 0x1f);
          uVar59 = *(uint *)(local_540 + (uint)(iVar15 << 2));
          uVar133 = *(uint *)(local_6a0 + (uint)(iVar15 << 2));
          fVar225 = auVar66._0_4_;
          if ((float)local_9e0._0_4_ < 0.0) {
            auVar256 = ZEXT1664(auVar256._0_16_);
            auVar261 = ZEXT1664(auVar261._0_16_);
            auVar262 = ZEXT1664(auVar262._0_16_);
            fVar225 = sqrtf((float)local_9e0._0_4_);
          }
          auVar251 = ZEXT464(uVar133);
          uVar58 = (ulong)bVar47;
          auVar67 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
          auVar60 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
          auVar11 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar61 = vminps_avx(auVar67,auVar11);
          auVar67 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar11 = vmaxps_avx(auVar60,auVar67);
          auVar211._8_4_ = 0x7fffffff;
          auVar211._0_8_ = 0x7fffffff7fffffff;
          auVar211._12_4_ = 0x7fffffff;
          auVar60 = vandps_avx(auVar61,auVar211);
          auVar67 = vandps_avx(auVar11,auVar211);
          auVar60 = vmaxps_avx(auVar60,auVar67);
          auVar67 = vmovshdup_avx(auVar60);
          auVar67 = vmaxss_avx(auVar67,auVar60);
          auVar60 = vshufpd_avx(auVar60,auVar60,1);
          auVar60 = vmaxss_avx(auVar60,auVar67);
          fVar200 = auVar60._0_4_ * 1.9073486e-06;
          local_920 = vshufps_avx(auVar11,auVar11,0xff);
          auVar60 = vinsertps_avx(ZEXT416(uVar133),ZEXT416(uVar59),0x10);
          auVar159 = ZEXT1664(auVar60);
          uVar54 = 0;
          while( true ) {
            bVar56 = (byte)uVar58;
            if (uVar54 == 5) break;
            uVar161 = auVar159._0_4_;
            auVar147._4_4_ = uVar161;
            auVar147._0_4_ = uVar161;
            auVar147._8_4_ = uVar161;
            auVar147._12_4_ = uVar161;
            auVar60 = vfmadd132ps_fma(auVar147,ZEXT816(0) << 0x40,local_9d0);
            auVar67 = vmovshdup_avx(auVar159._0_16_);
            fVar243 = auVar67._0_4_;
            fVar224 = 1.0 - fVar243;
            fVar219 = fVar243 * fVar243;
            auVar62 = SUB6416(ZEXT464(0x40400000),0);
            auVar68 = SUB6416(ZEXT464(0xc0a00000),0);
            auVar61 = vfmadd213ss_fma(auVar62,auVar67,auVar68);
            auVar11 = vfmadd213ss_fma(auVar61,ZEXT416((uint)fVar219),SUB6416(ZEXT464(0x40000000),0))
            ;
            auVar72 = vfmadd213ss_fma(auVar62,ZEXT416((uint)fVar224),auVar68);
            auVar72 = vfmadd213ss_fma(auVar72,ZEXT416((uint)(fVar224 * fVar224)),
                                      SUB6416(ZEXT464(0x40000000),0));
            fVar220 = fVar224 * fVar224 * -fVar243 * 0.5;
            fVar221 = auVar11._0_4_ * 0.5;
            fVar222 = auVar72._0_4_ * 0.5;
            fVar223 = fVar243 * fVar243 * -fVar224 * 0.5;
            auVar212._0_4_ = fVar223 * (float)local_9c0._0_4_;
            auVar212._4_4_ = fVar223 * (float)local_9c0._4_4_;
            auVar212._8_4_ = fVar223 * fStack_9b8;
            auVar212._12_4_ = fVar223 * fStack_9b4;
            auVar229._4_4_ = fVar222;
            auVar229._0_4_ = fVar222;
            auVar229._8_4_ = fVar222;
            auVar229._12_4_ = fVar222;
            auVar11 = vfmadd132ps_fma(auVar229,auVar212,local_980._0_16_);
            auVar189._4_4_ = fVar221;
            auVar189._0_4_ = fVar221;
            auVar189._8_4_ = fVar221;
            auVar189._12_4_ = fVar221;
            auVar11 = vfmadd132ps_fma(auVar189,auVar11,local_9a0._0_16_);
            auVar213._4_4_ = fVar220;
            auVar213._0_4_ = fVar220;
            auVar213._8_4_ = fVar220;
            auVar213._12_4_ = fVar220;
            auVar11 = vfmadd132ps_fma(auVar213,auVar11,local_960._0_16_);
            auVar72 = vfmadd231ss_fma(auVar68,auVar67,ZEXT416(0x41100000));
            local_880._0_16_ = auVar72;
            auVar72 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar67,ZEXT416(0x40800000));
            local_8a0._0_16_ = auVar72;
            auVar72 = vfmadd213ss_fma(auVar62,auVar67,ZEXT416(0xbf800000));
            local_8c0._0_16_ = auVar72;
            _local_860 = auVar11;
            auVar11 = vsubps_avx(auVar60,auVar11);
            auVar60 = vdpps_avx(auVar11,auVar11,0x7f);
            fVar220 = auVar60._0_4_;
            local_7c0 = auVar159;
            if (fVar220 < 0.0) {
              local_a00._0_4_ = fVar219;
              local_a20._0_4_ = fVar224 * -2.0;
              auVar261._0_4_ = sqrtf(fVar220);
              auVar261._4_60_ = extraout_var_00;
              auVar61 = ZEXT416(auVar61._0_4_);
              auVar72 = auVar261._0_16_;
              uVar58 = extraout_RAX_02;
            }
            else {
              auVar72 = vsqrtss_avx(auVar60,auVar60);
              local_a20._0_4_ = fVar224 * -2.0;
              local_a00._0_4_ = fVar219;
            }
            auVar69 = vfnmadd231ss_fma(ZEXT416((uint)(fVar243 * (fVar224 + fVar224))),
                                       ZEXT416((uint)fVar224),ZEXT416((uint)fVar224));
            auVar61 = vfmadd213ss_fma(auVar61,ZEXT416((uint)(fVar243 + fVar243)),
                                      ZEXT416((uint)(fVar243 * fVar243 * 3.0)));
            auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar67,
                                      SUB6416(ZEXT464(0x40000000),0));
            auVar62 = vfmadd231ss_fma(ZEXT416((uint)(fVar224 * fVar224 * -3.0)),
                                      ZEXT416((uint)(fVar224 + fVar224)),auVar68);
            auVar68 = vfmadd213ss_fma(ZEXT416((uint)local_a20._0_4_),auVar67,
                                      ZEXT416((uint)local_a00._0_4_));
            fVar219 = auVar69._0_4_ * 0.5;
            fVar221 = auVar61._0_4_ * 0.5;
            fVar222 = auVar62._0_4_ * 0.5;
            fVar223 = auVar68._0_4_ * 0.5;
            auVar214._0_4_ = fVar223 * (float)local_9c0._0_4_;
            auVar214._4_4_ = fVar223 * (float)local_9c0._4_4_;
            auVar214._8_4_ = fVar223 * fStack_9b8;
            auVar214._12_4_ = fVar223 * fStack_9b4;
            auVar190._4_4_ = fVar222;
            auVar190._0_4_ = fVar222;
            auVar190._8_4_ = fVar222;
            auVar190._12_4_ = fVar222;
            auVar61 = vfmadd132ps_fma(auVar190,auVar214,local_980._0_16_);
            auVar169._4_4_ = fVar221;
            auVar169._0_4_ = fVar221;
            auVar169._8_4_ = fVar221;
            auVar169._12_4_ = fVar221;
            auVar61 = vfmadd132ps_fma(auVar169,auVar61,local_9a0._0_16_);
            auVar265._4_4_ = fVar219;
            auVar265._0_4_ = fVar219;
            auVar265._8_4_ = fVar219;
            auVar265._12_4_ = fVar219;
            auVar61 = vfmadd132ps_fma(auVar265,auVar61,local_960._0_16_);
            local_a00._0_16_ = vdpps_avx(auVar61,auVar61,0x7f);
            auVar42._12_4_ = 0;
            auVar42._0_12_ = ZEXT812(0);
            fVar219 = local_a00._0_4_;
            auVar68 = vrsqrt14ss_avx512f(auVar42 << 0x20,ZEXT416((uint)fVar219));
            fVar221 = auVar68._0_4_;
            local_a20._0_16_ = vrcp14ss_avx512f(auVar42 << 0x20,ZEXT416((uint)fVar219));
            auVar21._8_4_ = 0x80000000;
            auVar21._0_8_ = 0x8000000080000000;
            auVar21._12_4_ = 0x80000000;
            auVar62 = vxorps_avx512vl(local_a00._0_16_,auVar21);
            auVar68 = vfnmadd213ss_fma(local_a20._0_16_,local_a00._0_16_,
                                       SUB6416(ZEXT464(0x40000000),0));
            local_8e0._0_4_ = auVar68._0_4_;
            uVar59 = auVar72._0_4_;
            if (fVar219 < auVar62._0_4_) {
              fVar222 = sqrtf(fVar219);
              auVar72 = ZEXT416(uVar59);
              uVar58 = extraout_RAX_03;
            }
            else {
              auVar68 = vsqrtss_avx(local_a00._0_16_,local_a00._0_16_);
              fVar222 = auVar68._0_4_;
            }
            fVar219 = fVar221 * 1.5 + fVar219 * -0.5 * fVar221 * fVar221 * fVar221;
            auVar148._0_4_ = auVar61._0_4_ * fVar219;
            auVar148._4_4_ = auVar61._4_4_ * fVar219;
            auVar148._8_4_ = auVar61._8_4_ * fVar219;
            auVar148._12_4_ = auVar61._12_4_ * fVar219;
            auVar68 = vdpps_avx(auVar11,auVar148,0x7f);
            fVar224 = auVar72._0_4_;
            fVar221 = auVar68._0_4_;
            auVar149._0_4_ = fVar221 * fVar221;
            auVar149._4_4_ = auVar68._4_4_ * auVar68._4_4_;
            auVar149._8_4_ = auVar68._8_4_ * auVar68._8_4_;
            auVar149._12_4_ = auVar68._12_4_ * auVar68._12_4_;
            auVar62 = vsubps_avx512vl(auVar60,auVar149);
            fVar223 = auVar62._0_4_;
            auVar170._4_12_ = ZEXT812(0) << 0x20;
            auVar170._0_4_ = fVar223;
            auVar69 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar170);
            auVar70 = vmulss_avx512f(auVar62,ZEXT416(0xbf000000));
            if (fVar223 < 0.0) {
              local_910 = fVar219;
              fStack_90c = fVar219;
              fStack_908 = fVar219;
              fStack_904 = fVar219;
              local_900 = auVar69;
              fVar223 = sqrtf(fVar223);
              auVar70 = ZEXT416(auVar70._0_4_);
              auVar72 = ZEXT416(uVar59);
              uVar58 = extraout_RAX_04;
              auVar62 = local_900;
              fVar219 = local_910;
              fVar243 = fStack_90c;
              fVar244 = fStack_908;
              fVar245 = fStack_904;
            }
            else {
              auVar62 = vsqrtss_avx(auVar62,auVar62);
              fVar223 = auVar62._0_4_;
              auVar62 = auVar69;
              fVar243 = fVar219;
              fVar244 = fVar219;
              fVar245 = fVar219;
            }
            auVar261 = ZEXT1664(auVar11);
            auVar171._0_4_ = (float)local_8c0._0_4_ * (float)local_9c0._0_4_;
            auVar171._4_4_ = (float)local_8c0._0_4_ * (float)local_9c0._4_4_;
            auVar171._8_4_ = (float)local_8c0._0_4_ * fStack_9b8;
            auVar171._12_4_ = (float)local_8c0._0_4_ * fStack_9b4;
            auVar191._4_4_ = local_8a0._0_4_;
            auVar191._0_4_ = local_8a0._0_4_;
            auVar191._8_4_ = local_8a0._0_4_;
            auVar191._12_4_ = local_8a0._0_4_;
            auVar64 = vfmadd132ps_fma(auVar191,auVar171,local_980._0_16_);
            auVar172._4_4_ = local_880._0_4_;
            auVar172._0_4_ = local_880._0_4_;
            auVar172._8_4_ = local_880._0_4_;
            auVar172._12_4_ = local_880._0_4_;
            auVar64 = vfmadd132ps_fma(auVar172,auVar64,local_9a0._0_16_);
            auVar67 = vfmadd213ss_fma(auVar67,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
            uVar161 = auVar67._0_4_;
            auVar192._4_4_ = uVar161;
            auVar192._0_4_ = uVar161;
            auVar192._8_4_ = uVar161;
            auVar192._12_4_ = uVar161;
            auVar67 = vfmadd132ps_fma(auVar192,auVar64,local_960._0_16_);
            auVar173._0_4_ = auVar67._0_4_ * (float)local_a00._0_4_;
            auVar173._4_4_ = auVar67._4_4_ * (float)local_a00._0_4_;
            auVar173._8_4_ = auVar67._8_4_ * (float)local_a00._0_4_;
            auVar173._12_4_ = auVar67._12_4_ * (float)local_a00._0_4_;
            auVar67 = vdpps_avx(auVar61,auVar67,0x7f);
            fVar179 = auVar67._0_4_;
            auVar193._0_4_ = auVar61._0_4_ * fVar179;
            auVar193._4_4_ = auVar61._4_4_ * fVar179;
            auVar193._8_4_ = auVar61._8_4_ * fVar179;
            auVar193._12_4_ = auVar61._12_4_ * fVar179;
            auVar67 = vsubps_avx(auVar173,auVar193);
            fVar179 = (float)local_8e0._0_4_ * (float)local_a20._0_4_;
            auVar64 = vmaxss_avx(ZEXT416((uint)fVar200),
                                 ZEXT416((uint)(local_7c0._0_4_ * fVar225 * 1.9073486e-06)));
            auVar22._8_4_ = 0x80000000;
            auVar22._0_8_ = 0x8000000080000000;
            auVar22._12_4_ = 0x80000000;
            auVar131._16_48_ = local_7c0._16_48_;
            auVar71 = vxorps_avx512vl(auVar61,auVar22);
            auVar194._0_4_ = fVar219 * auVar67._0_4_ * fVar179;
            auVar194._4_4_ = fVar243 * auVar67._4_4_ * fVar179;
            auVar194._8_4_ = fVar244 * auVar67._8_4_ * fVar179;
            auVar194._12_4_ = fVar245 * auVar67._12_4_ * fVar179;
            auVar262 = ZEXT1664(auVar148);
            auVar67 = vdpps_avx(auVar71,auVar148,0x7f);
            auVar63 = vfmadd213ss_fma(auVar72,ZEXT416((uint)fVar200),auVar64);
            auVar72 = vdpps_avx(auVar11,auVar194,0x7f);
            auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar224 + 1.0)),
                                      ZEXT416((uint)(fVar200 / fVar222)),auVar63);
            fVar219 = auVar67._0_4_ + auVar72._0_4_;
            auVar67 = vdpps_avx(local_9d0,auVar148,0x7f);
            auVar72 = vdpps_avx(auVar11,auVar71,0x7f);
            auVar70 = vmulss_avx512f(auVar70,auVar62);
            fVar222 = auVar69._0_4_ * 1.5 + auVar70._0_4_ * auVar62._0_4_ * auVar62._0_4_;
            auVar62 = vdpps_avx(auVar11,local_9d0,0x7f);
            auVar70 = vfnmadd231ss_fma(auVar72,auVar68,ZEXT416((uint)fVar219));
            auVar62 = vfnmadd231ss_fma(auVar62,auVar68,auVar67);
            auVar72 = vpermilps_avx(_local_860,0xff);
            fVar223 = fVar223 - auVar72._0_4_;
            auVar69 = vshufps_avx(auVar61,auVar61,0xff);
            auVar72 = vfmsub213ss_fma(auVar70,ZEXT416((uint)fVar222),auVar69);
            auVar254._8_4_ = 0x80000000;
            auVar254._0_8_ = 0x8000000080000000;
            auVar254._12_4_ = 0x80000000;
            auVar256 = ZEXT1664(auVar254);
            auVar249._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
            auVar249._8_4_ = auVar72._8_4_ ^ 0x80000000;
            auVar249._12_4_ = auVar72._12_4_ ^ 0x80000000;
            auVar251 = ZEXT1664(auVar249);
            auVar62 = ZEXT416((uint)(auVar62._0_4_ * fVar222));
            auVar70 = vfmsub231ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar72._0_4_)),
                                      ZEXT416((uint)fVar219),auVar62);
            auVar72 = vinsertps_avx(auVar249,auVar62,0x1c);
            auVar234._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
            auVar234._8_4_ = auVar67._8_4_ ^ 0x80000000;
            auVar234._12_4_ = auVar67._12_4_ ^ 0x80000000;
            auVar62 = vinsertps_avx(ZEXT416((uint)fVar219),auVar234,0x10);
            auVar215._0_4_ = auVar70._0_4_;
            auVar215._4_4_ = auVar215._0_4_;
            auVar215._8_4_ = auVar215._0_4_;
            auVar215._12_4_ = auVar215._0_4_;
            auVar67 = vdivps_avx(auVar72,auVar215);
            auVar72 = vdivps_avx(auVar62,auVar215);
            auVar216._0_4_ = fVar221 * auVar67._0_4_ + fVar223 * auVar72._0_4_;
            auVar216._4_4_ = fVar221 * auVar67._4_4_ + fVar223 * auVar72._4_4_;
            auVar216._8_4_ = fVar221 * auVar67._8_4_ + fVar223 * auVar72._8_4_;
            auVar216._12_4_ = fVar221 * auVar67._12_4_ + fVar223 * auVar72._12_4_;
            auVar67 = vsubps_avx(local_7c0._0_16_,auVar216);
            auVar159 = ZEXT1664(auVar67);
            auVar23._8_4_ = 0x7fffffff;
            auVar23._0_8_ = 0x7fffffff7fffffff;
            auVar23._12_4_ = 0x7fffffff;
            auVar72 = vandps_avx512vl(auVar68,auVar23);
            if (auVar72._0_4_ < auVar63._0_4_) {
              auVar72 = vfmadd231ss_fma(ZEXT416((uint)(auVar63._0_4_ + auVar64._0_4_)),local_920,
                                        ZEXT416(0x36000000));
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              auVar68 = vandps_avx512vl(ZEXT416((uint)fVar223),auVar24);
              if (auVar68._0_4_ < auVar72._0_4_) {
                bVar57 = uVar54 < 5;
                fVar225 = auVar67._0_4_ + (float)local_930._0_4_;
                if ((fVar160 <= fVar225) &&
                   (fVar200 = *(float *)(ray + k * 4 + 0x200), fVar225 <= fVar200)) {
                  auVar67 = vmovshdup_avx(auVar67);
                  bVar56 = 0;
                  if ((auVar67._0_4_ < 0.0) || (1.0 < auVar67._0_4_)) goto LAB_017fd4c0;
                  auVar217._0_12_ = ZEXT812(0);
                  auVar217._12_4_ = 0;
                  auVar131._0_16_ = auVar217;
                  auVar130._4_60_ = auVar131._4_60_;
                  auVar130._0_4_ = fVar220;
                  auVar67 = vrsqrt14ss_avx512f(auVar217,auVar130._0_16_);
                  fVar219 = auVar67._0_4_;
                  auVar60 = vmulss_avx512f(auVar60,ZEXT416(0xbf000000));
                  pGVar2 = (context->scene->geometries).items[uVar1].ptr;
                  if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar56 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_017fd4c0;
                    fVar219 = fVar219 * 1.5 + auVar60._0_4_ * fVar219 * fVar219 * fVar219;
                    auVar195._0_4_ = auVar11._0_4_ * fVar219;
                    auVar195._4_4_ = auVar11._4_4_ * fVar219;
                    auVar195._8_4_ = auVar11._8_4_ * fVar219;
                    auVar195._12_4_ = auVar11._12_4_ * fVar219;
                    auVar72 = vfmadd213ps_fma(auVar69,auVar195,auVar61);
                    auVar60 = vshufps_avx(auVar195,auVar195,0xc9);
                    auVar67 = vshufps_avx(auVar61,auVar61,0xc9);
                    auVar196._0_4_ = auVar195._0_4_ * auVar67._0_4_;
                    auVar196._4_4_ = auVar195._4_4_ * auVar67._4_4_;
                    auVar196._8_4_ = auVar195._8_4_ * auVar67._8_4_;
                    auVar196._12_4_ = auVar195._12_4_ * auVar67._12_4_;
                    auVar61 = vfmsub231ps_fma(auVar196,auVar61,auVar60);
                    auVar60 = vshufps_avx(auVar61,auVar61,0xc9);
                    auVar67 = vshufps_avx(auVar72,auVar72,0xc9);
                    auVar61 = vshufps_avx(auVar61,auVar61,0xd2);
                    auVar150._0_4_ = auVar72._0_4_ * auVar61._0_4_;
                    auVar150._4_4_ = auVar72._4_4_ * auVar61._4_4_;
                    auVar150._8_4_ = auVar72._8_4_ * auVar61._8_4_;
                    auVar150._12_4_ = auVar72._12_4_ * auVar61._12_4_;
                    auVar60 = vfmsub231ps_fma(auVar150,auVar60,auVar67);
                    auVar128 = vbroadcastss_avx512f(ZEXT416(1));
                    local_340 = vpermps_avx512f(auVar128,auVar159);
                    auVar159 = vpermps_avx512f(auVar128,ZEXT1664(auVar60));
                    auVar128 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar128,ZEXT1664(auVar60));
                    local_380 = vbroadcastss_avx512f(auVar60);
                    local_400[0] = (RTCHitN)auVar159[0];
                    local_400[1] = (RTCHitN)auVar159[1];
                    local_400[2] = (RTCHitN)auVar159[2];
                    local_400[3] = (RTCHitN)auVar159[3];
                    local_400[4] = (RTCHitN)auVar159[4];
                    local_400[5] = (RTCHitN)auVar159[5];
                    local_400[6] = (RTCHitN)auVar159[6];
                    local_400[7] = (RTCHitN)auVar159[7];
                    local_400[8] = (RTCHitN)auVar159[8];
                    local_400[9] = (RTCHitN)auVar159[9];
                    local_400[10] = (RTCHitN)auVar159[10];
                    local_400[0xb] = (RTCHitN)auVar159[0xb];
                    local_400[0xc] = (RTCHitN)auVar159[0xc];
                    local_400[0xd] = (RTCHitN)auVar159[0xd];
                    local_400[0xe] = (RTCHitN)auVar159[0xe];
                    local_400[0xf] = (RTCHitN)auVar159[0xf];
                    local_400[0x10] = (RTCHitN)auVar159[0x10];
                    local_400[0x11] = (RTCHitN)auVar159[0x11];
                    local_400[0x12] = (RTCHitN)auVar159[0x12];
                    local_400[0x13] = (RTCHitN)auVar159[0x13];
                    local_400[0x14] = (RTCHitN)auVar159[0x14];
                    local_400[0x15] = (RTCHitN)auVar159[0x15];
                    local_400[0x16] = (RTCHitN)auVar159[0x16];
                    local_400[0x17] = (RTCHitN)auVar159[0x17];
                    local_400[0x18] = (RTCHitN)auVar159[0x18];
                    local_400[0x19] = (RTCHitN)auVar159[0x19];
                    local_400[0x1a] = (RTCHitN)auVar159[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar159[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar159[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar159[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar159[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar159[0x1f];
                    local_400[0x20] = (RTCHitN)auVar159[0x20];
                    local_400[0x21] = (RTCHitN)auVar159[0x21];
                    local_400[0x22] = (RTCHitN)auVar159[0x22];
                    local_400[0x23] = (RTCHitN)auVar159[0x23];
                    local_400[0x24] = (RTCHitN)auVar159[0x24];
                    local_400[0x25] = (RTCHitN)auVar159[0x25];
                    local_400[0x26] = (RTCHitN)auVar159[0x26];
                    local_400[0x27] = (RTCHitN)auVar159[0x27];
                    local_400[0x28] = (RTCHitN)auVar159[0x28];
                    local_400[0x29] = (RTCHitN)auVar159[0x29];
                    local_400[0x2a] = (RTCHitN)auVar159[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar159[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar159[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar159[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar159[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar159[0x2f];
                    local_400[0x30] = (RTCHitN)auVar159[0x30];
                    local_400[0x31] = (RTCHitN)auVar159[0x31];
                    local_400[0x32] = (RTCHitN)auVar159[0x32];
                    local_400[0x33] = (RTCHitN)auVar159[0x33];
                    local_400[0x34] = (RTCHitN)auVar159[0x34];
                    local_400[0x35] = (RTCHitN)auVar159[0x35];
                    local_400[0x36] = (RTCHitN)auVar159[0x36];
                    local_400[0x37] = (RTCHitN)auVar159[0x37];
                    local_400[0x38] = (RTCHitN)auVar159[0x38];
                    local_400[0x39] = (RTCHitN)auVar159[0x39];
                    local_400[0x3a] = (RTCHitN)auVar159[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar159[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar159[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar159[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar159[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar159[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_480._0_8_;
                    uStack_2b8 = local_480._8_8_;
                    uStack_2b0 = local_480._16_8_;
                    uStack_2a8 = local_480._24_8_;
                    uStack_2a0 = local_480._32_8_;
                    uStack_298 = local_480._40_8_;
                    uStack_290 = local_480._48_8_;
                    uStack_288 = local_480._56_8_;
                    auVar159 = vmovdqa64_avx512f(local_4c0);
                    local_280 = vmovdqa64_avx512f(auVar159);
                    vpcmpeqd_avx2(auVar159._0_32_,auVar159._0_32_);
                    local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar225;
                    auVar159 = vmovdqa64_avx512f(local_500);
                    local_780 = vmovdqa64_avx512f(auVar159);
                    local_a50.valid = (int *)local_780;
                    local_a50.geometryUserPtr = pGVar2->userPtr;
                    local_a50.context = context->user;
                    local_a50.hit = local_400;
                    local_a50.N = 0x10;
                    local_a50.ray = (RTCRayN *)ray;
                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar251 = ZEXT1664(auVar249);
                      auVar256 = ZEXT1664(auVar254);
                      auVar261 = ZEXT1664(auVar11);
                      auVar262 = ZEXT1664(auVar148);
                      (*pGVar2->occlusionFilterN)(&local_a50);
                      auVar159 = vmovdqa64_avx512f(local_780);
                    }
                    uVar12 = vptestmd_avx512f(auVar159,auVar159);
                    if ((short)uVar12 != 0) {
                      p_Var3 = context->args->filter;
                      if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar251 = ZEXT1664(auVar251._0_16_);
                        auVar256 = ZEXT1664(auVar256._0_16_);
                        auVar261 = ZEXT1664(auVar261._0_16_);
                        auVar262 = ZEXT1664(auVar262._0_16_);
                        (*p_Var3)(&local_a50);
                        auVar159 = vmovdqa64_avx512f(local_780);
                      }
                      uVar58 = vptestmd_avx512f(auVar159,auVar159);
                      auVar159 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                      bVar4 = (bool)((byte)uVar58 & 1);
                      auVar132._0_4_ =
                           (uint)bVar4 * auVar159._0_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x200);
                      bVar4 = (bool)((byte)(uVar58 >> 1) & 1);
                      auVar132._4_4_ =
                           (uint)bVar4 * auVar159._4_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x204);
                      bVar4 = (bool)((byte)(uVar58 >> 2) & 1);
                      auVar132._8_4_ =
                           (uint)bVar4 * auVar159._8_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x208);
                      bVar4 = (bool)((byte)(uVar58 >> 3) & 1);
                      auVar132._12_4_ =
                           (uint)bVar4 * auVar159._12_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x20c);
                      bVar4 = (bool)((byte)(uVar58 >> 4) & 1);
                      auVar132._16_4_ =
                           (uint)bVar4 * auVar159._16_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x210);
                      bVar4 = (bool)((byte)(uVar58 >> 5) & 1);
                      auVar132._20_4_ =
                           (uint)bVar4 * auVar159._20_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x214);
                      bVar4 = (bool)((byte)(uVar58 >> 6) & 1);
                      auVar132._24_4_ =
                           (uint)bVar4 * auVar159._24_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x218);
                      bVar4 = (bool)((byte)(uVar58 >> 7) & 1);
                      auVar132._28_4_ =
                           (uint)bVar4 * auVar159._28_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x21c);
                      bVar4 = (bool)((byte)(uVar58 >> 8) & 1);
                      auVar132._32_4_ =
                           (uint)bVar4 * auVar159._32_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x220);
                      bVar4 = (bool)((byte)(uVar58 >> 9) & 1);
                      auVar132._36_4_ =
                           (uint)bVar4 * auVar159._36_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x224);
                      bVar4 = (bool)((byte)(uVar58 >> 10) & 1);
                      auVar132._40_4_ =
                           (uint)bVar4 * auVar159._40_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x228);
                      bVar4 = (bool)((byte)(uVar58 >> 0xb) & 1);
                      auVar132._44_4_ =
                           (uint)bVar4 * auVar159._44_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x22c);
                      bVar4 = (bool)((byte)(uVar58 >> 0xc) & 1);
                      auVar132._48_4_ =
                           (uint)bVar4 * auVar159._48_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x230);
                      bVar4 = (bool)((byte)(uVar58 >> 0xd) & 1);
                      auVar132._52_4_ =
                           (uint)bVar4 * auVar159._52_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x234);
                      bVar4 = (bool)((byte)(uVar58 >> 0xe) & 1);
                      auVar132._56_4_ =
                           (uint)bVar4 * auVar159._56_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x238);
                      bVar4 = SUB81(uVar58 >> 0xf,0);
                      auVar132._60_4_ =
                           (uint)bVar4 * auVar159._60_4_ |
                           (uint)!bVar4 * *(int *)(local_a50.ray + 0x23c);
                      *(undefined1 (*) [64])(local_a50.ray + 0x200) = auVar132;
                      bVar56 = 1;
                      if ((short)uVar58 != 0) goto LAB_017fd4c0;
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar200;
                  }
                }
                bVar56 = 0;
                goto LAB_017fd4c0;
              }
            }
            uVar54 = uVar54 + 1;
          }
          bVar57 = false;
LAB_017fd4c0:
          bVar49 = bVar49 | bVar57 & bVar56;
          uVar161 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar236._4_4_ = uVar161;
          auVar236._0_4_ = uVar161;
          auVar236._8_4_ = uVar161;
          auVar236._12_4_ = uVar161;
          auVar236._16_4_ = uVar161;
          auVar236._20_4_ = uVar161;
          auVar236._24_4_ = uVar161;
          auVar236._28_4_ = uVar161;
          auVar159 = ZEXT3264(auVar236);
          auVar44._4_4_ = fStack_71c;
          auVar44._0_4_ = local_720;
          auVar44._8_4_ = fStack_718;
          auVar44._12_4_ = fStack_714;
          auVar44._16_4_ = fStack_710;
          auVar44._20_4_ = fStack_70c;
          auVar44._24_4_ = fStack_708;
          auVar44._28_4_ = fStack_704;
          uVar12 = vcmpps_avx512vl(auVar236,auVar44,0xd);
        }
        uVar14 = vpcmpd_avx512vl(local_6e0,local_680,1);
        uVar13 = vpcmpd_avx512vl(local_6e0,_local_740,1);
        auVar176._0_4_ = (float)local_7e0._0_4_ + (float)local_440._0_4_;
        auVar176._4_4_ = (float)local_7e0._4_4_ + (float)local_440._4_4_;
        auVar176._8_4_ = fStack_7d8 + fStack_438;
        auVar176._12_4_ = fStack_7d4 + fStack_434;
        auVar176._16_4_ = fStack_7d0 + fStack_430;
        auVar176._20_4_ = fStack_7cc + fStack_42c;
        auVar176._24_4_ = fStack_7c8 + fStack_428;
        auVar176._28_4_ = fStack_7c4 + fStack_424;
        uVar161 = auVar159._0_4_;
        auVar198._4_4_ = uVar161;
        auVar198._0_4_ = uVar161;
        auVar198._8_4_ = uVar161;
        auVar198._12_4_ = uVar161;
        auVar198._16_4_ = uVar161;
        auVar198._20_4_ = uVar161;
        auVar198._24_4_ = uVar161;
        auVar198._28_4_ = uVar161;
        uVar12 = vcmpps_avx512vl(auVar176,auVar198,2);
        bVar52 = bVar52 & (byte)uVar14 & (byte)uVar12;
        auVar218._0_4_ = (float)local_7e0._0_4_ + local_6c0._0_4_;
        auVar218._4_4_ = (float)local_7e0._4_4_ + local_6c0._4_4_;
        auVar218._8_4_ = fStack_7d8 + local_6c0._8_4_;
        auVar218._12_4_ = fStack_7d4 + local_6c0._12_4_;
        auVar218._16_4_ = fStack_7d0 + local_6c0._16_4_;
        auVar218._20_4_ = fStack_7cc + local_6c0._20_4_;
        auVar218._24_4_ = fStack_7c8 + local_6c0._24_4_;
        auVar218._28_4_ = fStack_7c4 + local_6c0._28_4_;
        uVar12 = vcmpps_avx512vl(auVar218,auVar198,2);
        bVar46 = bVar46 & (byte)uVar13 & (byte)uVar12 | bVar52;
        if (bVar46 != 0) {
          abStack_1a0[uVar50 * 0x60] = bVar46;
          auVar124._0_4_ =
               (uint)(bVar52 & 1) * local_440._0_4_ |
               (uint)!(bool)(bVar52 & 1) * (int)local_6c0._0_4_;
          bVar57 = (bool)(bVar52 >> 1 & 1);
          auVar124._4_4_ = (uint)bVar57 * local_440._4_4_ | (uint)!bVar57 * (int)local_6c0._4_4_;
          bVar57 = (bool)(bVar52 >> 2 & 1);
          auVar124._8_4_ = (uint)bVar57 * (int)fStack_438 | (uint)!bVar57 * (int)local_6c0._8_4_;
          bVar57 = (bool)(bVar52 >> 3 & 1);
          auVar124._12_4_ = (uint)bVar57 * (int)fStack_434 | (uint)!bVar57 * (int)local_6c0._12_4_;
          bVar57 = (bool)(bVar52 >> 4 & 1);
          auVar124._16_4_ = (uint)bVar57 * (int)fStack_430 | (uint)!bVar57 * (int)local_6c0._16_4_;
          bVar57 = (bool)(bVar52 >> 5 & 1);
          auVar124._20_4_ = (uint)bVar57 * (int)fStack_42c | (uint)!bVar57 * (int)local_6c0._20_4_;
          auVar124._24_4_ =
               (uint)(bVar52 >> 6) * (int)fStack_428 |
               (uint)!(bool)(bVar52 >> 6) * (int)local_6c0._24_4_;
          auVar124._28_4_ = local_6c0._28_4_;
          *(undefined1 (*) [32])(auStack_180 + uVar50 * 0x60) = auVar124;
          uVar58 = vmovlps_avx(local_6f0);
          (&uStack_160)[uVar50 * 0xc] = uVar58;
          aiStack_158[uVar50 * 0x18] = local_ce8 + 1;
          uVar50 = (ulong)((int)uVar50 + 1);
        }
      }
      auVar159 = ZEXT3264(_DAT_01f7b040);
    }
    do {
      uVar59 = (uint)uVar50;
      uVar50 = (ulong)(uVar59 - 1);
      if (uVar59 == 0) {
        if (bVar49 != 0) goto LAB_017fdaa0;
        uVar161 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar25._4_4_ = uVar161;
        auVar25._0_4_ = uVar161;
        auVar25._8_4_ = uVar161;
        auVar25._12_4_ = uVar161;
        uVar12 = vcmpps_avx512vl(local_700,auVar25,2);
        uVar55 = (ulong)((uint)local_8e8 & (uint)uVar12);
        goto LAB_017fb0be;
      }
      lVar51 = uVar50 * 0x60;
      auVar83 = *(undefined1 (*) [32])(auStack_180 + lVar51);
      auVar177._0_4_ = auVar83._0_4_ + (float)local_7e0._0_4_;
      auVar177._4_4_ = auVar83._4_4_ + (float)local_7e0._4_4_;
      auVar177._8_4_ = auVar83._8_4_ + fStack_7d8;
      auVar177._12_4_ = auVar83._12_4_ + fStack_7d4;
      auVar177._16_4_ = auVar83._16_4_ + fStack_7d0;
      auVar177._20_4_ = auVar83._20_4_ + fStack_7cc;
      auVar177._24_4_ = auVar83._24_4_ + fStack_7c8;
      auVar177._28_4_ = auVar83._28_4_ + fStack_7c4;
      uVar161 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar29._4_4_ = uVar161;
      auVar29._0_4_ = uVar161;
      auVar29._8_4_ = uVar161;
      auVar29._12_4_ = uVar161;
      auVar29._16_4_ = uVar161;
      auVar29._20_4_ = uVar161;
      auVar29._24_4_ = uVar161;
      auVar29._28_4_ = uVar161;
      uVar12 = vcmpps_avx512vl(auVar177,auVar29,2);
      uVar133 = (uint)uVar12 & (uint)abStack_1a0[lVar51];
    } while (uVar133 == 0);
    uVar58 = (&uStack_160)[uVar50 * 0xc];
    auVar174._8_8_ = 0;
    auVar174._0_8_ = uVar58;
    auVar199._8_4_ = 0x7f800000;
    auVar199._0_8_ = 0x7f8000007f800000;
    auVar199._12_4_ = 0x7f800000;
    auVar199._16_4_ = 0x7f800000;
    auVar199._20_4_ = 0x7f800000;
    auVar199._24_4_ = 0x7f800000;
    auVar199._28_4_ = 0x7f800000;
    auVar84 = vblendmps_avx512vl(auVar199,auVar83);
    bVar46 = (byte)uVar133;
    auVar125._0_4_ =
         (uint)(bVar46 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar46 & 1) * (int)auVar83._0_4_;
    bVar57 = (bool)((byte)(uVar133 >> 1) & 1);
    auVar125._4_4_ = (uint)bVar57 * auVar84._4_4_ | (uint)!bVar57 * (int)auVar83._4_4_;
    bVar57 = (bool)((byte)(uVar133 >> 2) & 1);
    auVar125._8_4_ = (uint)bVar57 * auVar84._8_4_ | (uint)!bVar57 * (int)auVar83._8_4_;
    bVar57 = (bool)((byte)(uVar133 >> 3) & 1);
    auVar125._12_4_ = (uint)bVar57 * auVar84._12_4_ | (uint)!bVar57 * (int)auVar83._12_4_;
    bVar57 = (bool)((byte)(uVar133 >> 4) & 1);
    auVar125._16_4_ = (uint)bVar57 * auVar84._16_4_ | (uint)!bVar57 * (int)auVar83._16_4_;
    bVar57 = (bool)((byte)(uVar133 >> 5) & 1);
    auVar125._20_4_ = (uint)bVar57 * auVar84._20_4_ | (uint)!bVar57 * (int)auVar83._20_4_;
    bVar57 = (bool)((byte)(uVar133 >> 6) & 1);
    auVar125._24_4_ = (uint)bVar57 * auVar84._24_4_ | (uint)!bVar57 * (int)auVar83._24_4_;
    auVar125._28_4_ =
         (uVar133 >> 7) * auVar84._28_4_ | (uint)!SUB41(uVar133 >> 7,0) * (int)auVar83._28_4_;
    auVar83 = vshufps_avx(auVar125,auVar125,0xb1);
    auVar83 = vminps_avx(auVar125,auVar83);
    auVar84 = vshufpd_avx(auVar83,auVar83,5);
    auVar83 = vminps_avx(auVar83,auVar84);
    auVar84 = vpermpd_avx2(auVar83,0x4e);
    auVar83 = vminps_avx(auVar83,auVar84);
    uVar12 = vcmpps_avx512vl(auVar125,auVar83,0);
    bVar53 = (byte)uVar12 & bVar46;
    if (bVar53 != 0) {
      uVar133 = (uint)bVar53;
    }
    uVar134 = 0;
    for (; (uVar133 & 1) == 0; uVar133 = uVar133 >> 1 | 0x80000000) {
      uVar134 = uVar134 + 1;
    }
    local_ce8 = aiStack_158[uVar50 * 0x18];
    bVar46 = ~('\x01' << ((byte)uVar134 & 0x1f)) & bVar46;
    abStack_1a0[lVar51] = bVar46;
    if (bVar46 == 0) {
      uVar59 = uVar59 - 1;
    }
    uVar161 = (undefined4)uVar58;
    auVar158._4_4_ = uVar161;
    auVar158._0_4_ = uVar161;
    auVar158._8_4_ = uVar161;
    auVar158._12_4_ = uVar161;
    auVar158._16_4_ = uVar161;
    auVar158._20_4_ = uVar161;
    auVar158._24_4_ = uVar161;
    auVar158._28_4_ = uVar161;
    auVar60 = vmovshdup_avx(auVar174);
    auVar60 = vsubps_avx(auVar60,auVar174);
    auVar178._0_4_ = auVar60._0_4_;
    auVar178._4_4_ = auVar178._0_4_;
    auVar178._8_4_ = auVar178._0_4_;
    auVar178._12_4_ = auVar178._0_4_;
    auVar178._16_4_ = auVar178._0_4_;
    auVar178._20_4_ = auVar178._0_4_;
    auVar178._24_4_ = auVar178._0_4_;
    auVar178._28_4_ = auVar178._0_4_;
    auVar60 = vfmadd132ps_fma(auVar178,auVar158,auVar159._0_32_);
    auVar83 = ZEXT1632(auVar60);
    local_400[0] = (RTCHitN)auVar83[0];
    local_400[1] = (RTCHitN)auVar83[1];
    local_400[2] = (RTCHitN)auVar83[2];
    local_400[3] = (RTCHitN)auVar83[3];
    local_400[4] = (RTCHitN)auVar83[4];
    local_400[5] = (RTCHitN)auVar83[5];
    local_400[6] = (RTCHitN)auVar83[6];
    local_400[7] = (RTCHitN)auVar83[7];
    local_400[8] = (RTCHitN)auVar83[8];
    local_400[9] = (RTCHitN)auVar83[9];
    local_400[10] = (RTCHitN)auVar83[10];
    local_400[0xb] = (RTCHitN)auVar83[0xb];
    local_400[0xc] = (RTCHitN)auVar83[0xc];
    local_400[0xd] = (RTCHitN)auVar83[0xd];
    local_400[0xe] = (RTCHitN)auVar83[0xe];
    local_400[0xf] = (RTCHitN)auVar83[0xf];
    local_400[0x10] = (RTCHitN)auVar83[0x10];
    local_400[0x11] = (RTCHitN)auVar83[0x11];
    local_400[0x12] = (RTCHitN)auVar83[0x12];
    local_400[0x13] = (RTCHitN)auVar83[0x13];
    local_400[0x14] = (RTCHitN)auVar83[0x14];
    local_400[0x15] = (RTCHitN)auVar83[0x15];
    local_400[0x16] = (RTCHitN)auVar83[0x16];
    local_400[0x17] = (RTCHitN)auVar83[0x17];
    local_400[0x18] = (RTCHitN)auVar83[0x18];
    local_400[0x19] = (RTCHitN)auVar83[0x19];
    local_400[0x1a] = (RTCHitN)auVar83[0x1a];
    local_400[0x1b] = (RTCHitN)auVar83[0x1b];
    local_400[0x1c] = (RTCHitN)auVar83[0x1c];
    local_400[0x1d] = (RTCHitN)auVar83[0x1d];
    local_400[0x1e] = (RTCHitN)auVar83[0x1e];
    local_400[0x1f] = (RTCHitN)auVar83[0x1f];
    local_6f0._8_8_ = 0;
    local_6f0._0_8_ = *(ulong *)(local_400 + (ulong)uVar134 * 4);
    uVar50 = (ulong)uVar59;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }